

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

void embree::avx2::CurveNvIntersectorK<4,4>::
     intersect_t<embree::avx2::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined4 uVar1;
  undefined8 uVar2;
  Primitive PVar3;
  undefined4 uVar4;
  RTCFilterFunctionN p_Var5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  int iVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  bool bVar50;
  undefined1 auVar51 [12];
  bool bVar52;
  bool bVar53;
  bool bVar54;
  bool bVar55;
  bool bVar56;
  bool bVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  uint uVar91;
  uint uVar92;
  ulong uVar93;
  ulong uVar94;
  uint uVar95;
  long lVar96;
  undefined1 auVar97 [8];
  undefined4 uVar98;
  ulong uVar99;
  bool bVar100;
  float fVar101;
  float fVar127;
  float fVar128;
  vint4 bi_2;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar102;
  undefined1 auVar116 [16];
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  float fVar129;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined8 extraout_XMM1_Qa;
  vint4 bi_1;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar142 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar148 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  float fVar165;
  undefined1 auVar175 [32];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar181;
  float fVar182;
  float fVar183;
  undefined1 auVar174 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [64];
  vint4 ai_2;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  float fVar204;
  float fVar217;
  float fVar218;
  vint4 ai;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  float fVar220;
  undefined1 auVar213 [32];
  float fVar219;
  float fVar221;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [64];
  vint4 bi;
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [16];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar236 [16];
  undefined1 auVar235 [16];
  undefined1 auVar241 [32];
  undefined1 auVar237 [16];
  float fVar243;
  float fVar244;
  undefined1 auVar242 [64];
  float fVar256;
  vint4 ai_1;
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [32];
  float fVar257;
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar261 [16];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  float fVar278;
  undefined1 auVar276 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  float fVar258;
  float fVar268;
  float fVar269;
  undefined1 auVar259 [16];
  float fVar270;
  float fVar273;
  undefined1 auVar263 [28];
  undefined1 auVar262 [16];
  float fVar271;
  float fVar272;
  undefined1 auVar267 [64];
  undefined1 auVar274 [16];
  undefined1 auVar277 [64];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [32];
  undefined1 auVar283 [64];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  float fVar290;
  float fVar291;
  undefined1 auVar289 [64];
  undefined1 auVar292 [16];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  float fVar300;
  float fVar301;
  float fVar302;
  float fVar303;
  float fVar304;
  undefined1 auVar299 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  float P_err;
  vboolx_conflict valid;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  undefined1 local_c00 [32];
  undefined8 local_b60;
  undefined8 uStack_b58;
  float local_b48;
  float local_b44;
  undefined1 local_b40 [32];
  undefined1 local_b10 [8];
  float fStack_b08;
  float fStack_b04;
  undefined1 local_b00 [16];
  undefined1 local_af0 [16];
  undefined1 local_ae0 [16];
  RTCFilterFunctionNArguments local_ad0;
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [8];
  float fStack_a38;
  float fStack_a34;
  undefined1 auStack_a30 [16];
  undefined8 *local_a08;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_990 [16];
  undefined1 local_980 [16];
  undefined1 local_970 [16];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined8 local_920;
  undefined8 uStack_918;
  undefined1 local_910 [16];
  Primitive *local_8f8;
  Primitive *local_8f0;
  ulong local_8e8;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined4 local_8a0;
  undefined4 uStack_89c;
  undefined4 uStack_898;
  undefined4 uStack_894;
  undefined4 uStack_890;
  undefined4 uStack_88c;
  undefined4 uStack_888;
  undefined4 uStack_884;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined4 uStack_864;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined4 local_720;
  undefined4 uStack_71c;
  undefined4 uStack_718;
  undefined4 uStack_714;
  uint local_710;
  uint uStack_70c;
  uint uStack_708;
  uint uStack_704;
  RTCHitN local_700 [16];
  undefined1 auStack_6f0 [16];
  undefined4 local_6e0;
  undefined4 uStack_6dc;
  undefined4 uStack_6d8;
  undefined4 uStack_6d4;
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [16];
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined1 local_6a0 [16];
  uint local_690;
  uint uStack_68c;
  uint uStack_688;
  uint uStack_684;
  uint uStack_680;
  uint uStack_67c;
  uint uStack_678;
  uint uStack_674;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  undefined4 uStack_644;
  undefined1 local_640 [32];
  uint local_620;
  uint uStack_61c;
  uint uStack_618;
  uint uStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  uint uStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined4 local_460;
  undefined4 uStack_45c;
  undefined4 uStack_458;
  undefined4 uStack_454;
  undefined4 uStack_450;
  undefined4 uStack_44c;
  undefined4 uStack_448;
  undefined4 uStack_444;
  undefined4 local_440;
  undefined4 uStack_43c;
  undefined4 uStack_438;
  undefined4 uStack_434;
  undefined4 uStack_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined4 local_420;
  undefined4 uStack_41c;
  undefined4 uStack_418;
  undefined4 uStack_414;
  undefined4 uStack_410;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined4 uStack_404;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar260 [16];
  undefined1 auVar275 [16];
  
  PVar3 = prim[1];
  uVar99 = (ulong)(byte)PVar3;
  lVar96 = uVar99 * 0x19;
  fVar101 = *(float *)(prim + lVar96 + 0x12);
  auVar192 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar192 = vinsertps_avx(auVar192,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar261 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar261 = vinsertps_avx(auVar261,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar192 = vsubps_avx(auVar192,*(undefined1 (*) [16])(prim + lVar96 + 6));
  auVar103._0_4_ = fVar101 * auVar192._0_4_;
  auVar103._4_4_ = fVar101 * auVar192._4_4_;
  auVar103._8_4_ = fVar101 * auVar192._8_4_;
  auVar103._12_4_ = fVar101 * auVar192._12_4_;
  auVar222._0_4_ = fVar101 * auVar261._0_4_;
  auVar222._4_4_ = fVar101 * auVar261._4_4_;
  auVar222._8_4_ = fVar101 * auVar261._8_4_;
  auVar222._12_4_ = fVar101 * auVar261._12_4_;
  auVar192 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 * 4 + 6)));
  auVar192 = vcvtdq2ps_avx(auVar192);
  auVar261 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 * 5 + 6)));
  auVar261 = vcvtdq2ps_avx(auVar261);
  auVar112 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 * 6 + 6)));
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 * 0xb + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar298 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar298 = vcvtdq2ps_avx(auVar298);
  auVar292 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar99 + 6)));
  auVar292 = vcvtdq2ps_avx(auVar292);
  uVar93 = (ulong)(uint)((int)(uVar99 * 9) * 2);
  auVar106 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + 6)));
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar105 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + uVar99 + 6)));
  auVar105 = vcvtdq2ps_avx(auVar105);
  uVar93 = (ulong)(uint)((int)(uVar99 * 5) << 2);
  auVar138 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + 6)));
  auVar138 = vcvtdq2ps_avx(auVar138);
  auVar296._4_4_ = auVar222._0_4_;
  auVar296._0_4_ = auVar222._0_4_;
  auVar296._8_4_ = auVar222._0_4_;
  auVar296._12_4_ = auVar222._0_4_;
  auVar134 = vshufps_avx(auVar222,auVar222,0x55);
  auVar104 = vshufps_avx(auVar222,auVar222,0xaa);
  fVar101 = auVar104._0_4_;
  auVar279._0_4_ = fVar101 * auVar112._0_4_;
  fVar204 = auVar104._4_4_;
  auVar279._4_4_ = fVar204 * auVar112._4_4_;
  fVar217 = auVar104._8_4_;
  auVar279._8_4_ = fVar217 * auVar112._8_4_;
  fVar218 = auVar104._12_4_;
  auVar279._12_4_ = fVar218 * auVar112._12_4_;
  auVar274._0_4_ = auVar292._0_4_ * fVar101;
  auVar274._4_4_ = auVar292._4_4_ * fVar204;
  auVar274._8_4_ = auVar292._8_4_ * fVar217;
  auVar274._12_4_ = auVar292._12_4_ * fVar218;
  auVar245._0_4_ = auVar138._0_4_ * fVar101;
  auVar245._4_4_ = auVar138._4_4_ * fVar204;
  auVar245._8_4_ = auVar138._8_4_ * fVar217;
  auVar245._12_4_ = auVar138._12_4_ * fVar218;
  auVar104 = vfmadd231ps_fma(auVar279,auVar134,auVar261);
  auVar135 = vfmadd231ps_fma(auVar274,auVar134,auVar298);
  auVar134 = vfmadd231ps_fma(auVar245,auVar105,auVar134);
  auVar184 = vfmadd231ps_fma(auVar104,auVar296,auVar192);
  auVar135 = vfmadd231ps_fma(auVar135,auVar296,auVar7);
  auVar206 = vfmadd231ps_fma(auVar134,auVar106,auVar296);
  auVar297._4_4_ = auVar103._0_4_;
  auVar297._0_4_ = auVar103._0_4_;
  auVar297._8_4_ = auVar103._0_4_;
  auVar297._12_4_ = auVar103._0_4_;
  auVar134 = vshufps_avx(auVar103,auVar103,0x55);
  auVar104 = vshufps_avx(auVar103,auVar103,0xaa);
  fVar101 = auVar104._0_4_;
  auVar223._0_4_ = fVar101 * auVar112._0_4_;
  fVar204 = auVar104._4_4_;
  auVar223._4_4_ = fVar204 * auVar112._4_4_;
  fVar217 = auVar104._8_4_;
  auVar223._8_4_ = fVar217 * auVar112._8_4_;
  fVar218 = auVar104._12_4_;
  auVar223._12_4_ = fVar218 * auVar112._12_4_;
  auVar133._0_4_ = auVar292._0_4_ * fVar101;
  auVar133._4_4_ = auVar292._4_4_ * fVar204;
  auVar133._8_4_ = auVar292._8_4_ * fVar217;
  auVar133._12_4_ = auVar292._12_4_ * fVar218;
  auVar104._0_4_ = auVar138._0_4_ * fVar101;
  auVar104._4_4_ = auVar138._4_4_ * fVar204;
  auVar104._8_4_ = auVar138._8_4_ * fVar217;
  auVar104._12_4_ = auVar138._12_4_ * fVar218;
  auVar261 = vfmadd231ps_fma(auVar223,auVar134,auVar261);
  auVar112 = vfmadd231ps_fma(auVar133,auVar134,auVar298);
  auVar298 = vfmadd231ps_fma(auVar104,auVar134,auVar105);
  auVar292 = vfmadd231ps_fma(auVar261,auVar297,auVar192);
  auVar105 = vfmadd231ps_fma(auVar112,auVar297,auVar7);
  auVar138 = vfmadd231ps_fma(auVar298,auVar297,auVar106);
  local_980._8_4_ = 0x7fffffff;
  local_980._0_8_ = 0x7fffffff7fffffff;
  local_980._12_4_ = 0x7fffffff;
  auVar192 = vandps_avx(auVar184,local_980);
  auVar205._8_4_ = 0x219392ef;
  auVar205._0_8_ = 0x219392ef219392ef;
  auVar205._12_4_ = 0x219392ef;
  auVar192 = vcmpps_avx(auVar192,auVar205,1);
  auVar261 = vblendvps_avx(auVar184,auVar205,auVar192);
  auVar192 = vandps_avx(auVar135,local_980);
  auVar192 = vcmpps_avx(auVar192,auVar205,1);
  auVar112 = vblendvps_avx(auVar135,auVar205,auVar192);
  auVar192 = vandps_avx(auVar206,local_980);
  auVar192 = vcmpps_avx(auVar192,auVar205,1);
  auVar192 = vblendvps_avx(auVar206,auVar205,auVar192);
  auVar7 = vrcpps_avx(auVar261);
  auVar235._8_4_ = 0x3f800000;
  auVar235._0_8_ = &DAT_3f8000003f800000;
  auVar235._12_4_ = 0x3f800000;
  auVar261 = vfnmadd213ps_fma(auVar261,auVar7,auVar235);
  auVar7 = vfmadd132ps_fma(auVar261,auVar7,auVar7);
  auVar261 = vrcpps_avx(auVar112);
  auVar112 = vfnmadd213ps_fma(auVar112,auVar261,auVar235);
  auVar298 = vfmadd132ps_fma(auVar112,auVar261,auVar261);
  auVar261 = vrcpps_avx(auVar192);
  auVar192 = vfnmadd213ps_fma(auVar192,auVar261,auVar235);
  auVar106 = vfmadd132ps_fma(auVar192,auVar261,auVar261);
  auVar192._8_8_ = 0;
  auVar192._0_8_ = *(ulong *)(prim + uVar99 * 7 + 6);
  auVar192 = vpmovsxwd_avx(auVar192);
  auVar192 = vcvtdq2ps_avx(auVar192);
  auVar192 = vsubps_avx(auVar192,auVar292);
  auVar206._0_4_ = auVar7._0_4_ * auVar192._0_4_;
  auVar206._4_4_ = auVar7._4_4_ * auVar192._4_4_;
  auVar206._8_4_ = auVar7._8_4_ * auVar192._8_4_;
  auVar206._12_4_ = auVar7._12_4_ * auVar192._12_4_;
  auVar261._8_8_ = 0;
  auVar261._0_8_ = *(ulong *)(prim + uVar99 * 9 + 6);
  auVar192 = vpmovsxwd_avx(auVar261);
  auVar192 = vcvtdq2ps_avx(auVar192);
  auVar192 = vsubps_avx(auVar192,auVar292);
  auVar224._0_4_ = auVar7._0_4_ * auVar192._0_4_;
  auVar224._4_4_ = auVar7._4_4_ * auVar192._4_4_;
  auVar224._8_4_ = auVar7._8_4_ * auVar192._8_4_;
  auVar224._12_4_ = auVar7._12_4_ * auVar192._12_4_;
  auVar135._1_3_ = 0;
  auVar135[0] = PVar3;
  auVar112._8_8_ = 0;
  auVar112._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar261 = vpmovsxwd_avx(auVar112);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar99 * -2 + 6);
  auVar192 = vpmovsxwd_avx(auVar7);
  auVar192 = vcvtdq2ps_avx(auVar192);
  auVar192 = vsubps_avx(auVar192,auVar105);
  auVar246._0_4_ = auVar192._0_4_ * auVar298._0_4_;
  auVar246._4_4_ = auVar192._4_4_ * auVar298._4_4_;
  auVar246._8_4_ = auVar192._8_4_ * auVar298._8_4_;
  auVar246._12_4_ = auVar192._12_4_ * auVar298._12_4_;
  auVar192 = vcvtdq2ps_avx(auVar261);
  auVar192 = vsubps_avx(auVar192,auVar105);
  auVar134._0_4_ = auVar298._0_4_ * auVar192._0_4_;
  auVar134._4_4_ = auVar298._4_4_ * auVar192._4_4_;
  auVar134._8_4_ = auVar298._8_4_ * auVar192._8_4_;
  auVar134._12_4_ = auVar298._12_4_ * auVar192._12_4_;
  auVar298._8_8_ = 0;
  auVar298._0_8_ = *(ulong *)(prim + uVar93 + uVar99 + 6);
  auVar192 = vpmovsxwd_avx(auVar298);
  auVar192 = vcvtdq2ps_avx(auVar192);
  auVar192 = vsubps_avx(auVar192,auVar138);
  auVar184._0_4_ = auVar106._0_4_ * auVar192._0_4_;
  auVar184._4_4_ = auVar106._4_4_ * auVar192._4_4_;
  auVar184._8_4_ = auVar106._8_4_ * auVar192._8_4_;
  auVar184._12_4_ = auVar106._12_4_ * auVar192._12_4_;
  auVar292._8_8_ = 0;
  auVar292._0_8_ = *(ulong *)(prim + uVar99 * 0x17 + 6);
  auVar192 = vpmovsxwd_avx(auVar292);
  auVar192 = vcvtdq2ps_avx(auVar192);
  auVar192 = vsubps_avx(auVar192,auVar138);
  auVar105._0_4_ = auVar106._0_4_ * auVar192._0_4_;
  auVar105._4_4_ = auVar106._4_4_ * auVar192._4_4_;
  auVar105._8_4_ = auVar106._8_4_ * auVar192._8_4_;
  auVar105._12_4_ = auVar106._12_4_ * auVar192._12_4_;
  auVar192 = vpminsd_avx(auVar206,auVar224);
  auVar261 = vpminsd_avx(auVar246,auVar134);
  auVar192 = vmaxps_avx(auVar192,auVar261);
  auVar261 = vpminsd_avx(auVar184,auVar105);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar259._4_4_ = uVar1;
  auVar259._0_4_ = uVar1;
  auVar259._8_4_ = uVar1;
  auVar259._12_4_ = uVar1;
  auVar261 = vmaxps_avx(auVar261,auVar259);
  auVar192 = vmaxps_avx(auVar192,auVar261);
  local_4d0._0_4_ = auVar192._0_4_ * 0.99999964;
  local_4d0._4_4_ = auVar192._4_4_ * 0.99999964;
  local_4d0._8_4_ = auVar192._8_4_ * 0.99999964;
  local_4d0._12_4_ = auVar192._12_4_ * 0.99999964;
  auVar192 = vpmaxsd_avx(auVar206,auVar224);
  auVar261 = vpmaxsd_avx(auVar246,auVar134);
  auVar192 = vminps_avx(auVar192,auVar261);
  auVar261 = vpmaxsd_avx(auVar184,auVar105);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar138._4_4_ = uVar1;
  auVar138._0_4_ = uVar1;
  auVar138._8_4_ = uVar1;
  auVar138._12_4_ = uVar1;
  auVar261 = vminps_avx(auVar261,auVar138);
  auVar192 = vminps_avx(auVar192,auVar261);
  auVar106._0_4_ = auVar192._0_4_ * 1.0000004;
  auVar106._4_4_ = auVar192._4_4_ * 1.0000004;
  auVar106._8_4_ = auVar192._8_4_ * 1.0000004;
  auVar106._12_4_ = auVar192._12_4_ * 1.0000004;
  auVar135[4] = PVar3;
  auVar135._5_3_ = 0;
  auVar135[8] = PVar3;
  auVar135._9_3_ = 0;
  auVar135[0xc] = PVar3;
  auVar135._13_3_ = 0;
  auVar261 = vpcmpgtd_avx(auVar135,_DAT_01ff0cf0);
  auVar192 = vcmpps_avx(local_4d0,auVar106,2);
  auVar192 = vandps_avx(auVar192,auVar261);
  uVar95 = vmovmskps_avx(auVar192);
  if (uVar95 == 0) {
    return;
  }
  uVar95 = uVar95 & 0xff;
  local_8f8 = prim + lVar96 + 0x16;
  auVar117._16_16_ = mm_lookupmask_ps._240_16_;
  auVar117._0_16_ = mm_lookupmask_ps._240_16_;
  local_240 = vblendps_avx(auVar117,ZEXT832(0) << 0x20,0x80);
  local_a08 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_8a0 = 0x7fffffff;
  uStack_89c = 0x7fffffff;
  uStack_898 = 0x7fffffff;
  uStack_894 = 0x7fffffff;
  uStack_890 = 0x7fffffff;
  uStack_88c = 0x7fffffff;
  uStack_888 = 0x7fffffff;
  uStack_884 = 0x7fffffff;
  local_620 = 0x80000000;
  uStack_61c = 0x80000000;
  uStack_618 = 0x80000000;
  uStack_614 = 0x80000000;
  fStack_610 = -0.0;
  fStack_60c = -0.0;
  fStack_608 = -0.0;
  uStack_604 = 0x80000000;
  local_8f0 = prim;
LAB_0166265b:
  lVar96 = 0;
  local_8e8 = (ulong)uVar95;
  for (uVar99 = local_8e8; (uVar99 & 1) == 0; uVar99 = uVar99 >> 1 | 0x8000000000000000) {
    lVar96 = lVar96 + 1;
  }
  local_8e8 = local_8e8 - 1 & local_8e8;
  uVar1 = *(undefined4 *)(local_8f0 + lVar96 * 4 + 6);
  uVar99 = (ulong)(uint)((int)lVar96 << 6);
  auVar192 = *(undefined1 (*) [16])(local_8f8 + uVar99);
  if (local_8e8 != 0) {
    uVar94 = local_8e8 - 1 & local_8e8;
    for (uVar93 = local_8e8; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x8000000000000000) {
    }
    if (uVar94 != 0) {
      for (; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar261 = *(undefined1 (*) [16])(local_8f8 + uVar99 + 0x10);
  auVar112 = *(undefined1 (*) [16])(local_8f8 + uVar99 + 0x20);
  auVar7 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c
                        );
  auVar292 = vinsertps_avx(auVar7,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar98 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar247._4_4_ = uVar98;
  auVar247._0_4_ = uVar98;
  auVar247._8_4_ = uVar98;
  auVar247._12_4_ = uVar98;
  fStack_7f0 = (float)uVar98;
  _local_800 = auVar247;
  fStack_7ec = (float)uVar98;
  fStack_7e8 = (float)uVar98;
  register0x0000141c = uVar98;
  auVar7 = *(undefined1 (*) [16])(local_8f8 + uVar99 + 0x30);
  uVar98 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar260._4_4_ = uVar98;
  auVar260._0_4_ = uVar98;
  auVar260._8_4_ = uVar98;
  auVar260._12_4_ = uVar98;
  fStack_810 = (float)uVar98;
  _local_820 = auVar260;
  fStack_80c = (float)uVar98;
  fStack_808 = (float)uVar98;
  register0x0000145c = uVar98;
  auVar267 = ZEXT3264(_local_820);
  auVar298 = vunpcklps_avx(auVar247,auVar260);
  fVar101 = *(float *)(ray + k * 4 + 0x60);
  auVar275._4_4_ = fVar101;
  auVar275._0_4_ = fVar101;
  auVar275._8_4_ = fVar101;
  auVar275._12_4_ = fVar101;
  fStack_870 = fVar101;
  _local_880 = auVar275;
  fStack_86c = fVar101;
  fStack_868 = fVar101;
  uStack_864 = fVar101;
  auVar277 = ZEXT3264(_local_880);
  local_970 = vinsertps_avx(auVar298,auVar275,0x28);
  auVar283 = ZEXT1664(local_970);
  auVar225._0_4_ = (auVar192._0_4_ + auVar261._0_4_ + auVar112._0_4_ + auVar7._0_4_) * 0.25;
  auVar225._4_4_ = (auVar192._4_4_ + auVar261._4_4_ + auVar112._4_4_ + auVar7._4_4_) * 0.25;
  auVar225._8_4_ = (auVar192._8_4_ + auVar261._8_4_ + auVar112._8_4_ + auVar7._8_4_) * 0.25;
  auVar225._12_4_ = (auVar192._12_4_ + auVar261._12_4_ + auVar112._12_4_ + auVar7._12_4_) * 0.25;
  auVar298 = vsubps_avx(auVar225,auVar292);
  auVar298 = vdpps_avx(auVar298,local_970,0x7f);
  local_990 = vdpps_avx(local_970,local_970,0x7f);
  auVar289 = ZEXT1664(local_990);
  uVar95 = *(uint *)(local_8f0 + 2);
  auVar106 = vrcpss_avx(local_990,local_990);
  auVar105 = vfnmadd213ss_fma(auVar106,local_990,ZEXT416(0x40000000));
  auVar242 = ZEXT1664(auVar105);
  local_260 = auVar298._0_4_ * auVar106._0_4_ * auVar105._0_4_;
  auVar232._4_4_ = local_260;
  auVar232._0_4_ = local_260;
  auVar232._8_4_ = local_260;
  auVar232._12_4_ = local_260;
  fStack_7b0 = local_260;
  _local_7c0 = auVar232;
  fStack_7ac = local_260;
  fStack_7a8 = local_260;
  fStack_7a4 = local_260;
  auVar298 = vfmadd231ps_fma(auVar292,local_970,auVar232);
  auVar298 = vblendps_avx(auVar298,_DAT_01feba10,8);
  local_ae0 = vsubps_avx(auVar192,auVar298);
  local_af0 = vsubps_avx(auVar112,auVar298);
  local_b00 = vsubps_avx(auVar261,auVar298);
  _local_b10 = vsubps_avx(auVar7,auVar298);
  auVar192 = vmovshdup_avx(local_ae0);
  local_320 = auVar192._0_8_;
  uStack_318 = local_320;
  uStack_310 = local_320;
  uStack_308 = local_320;
  auVar192 = vshufps_avx(local_ae0,local_ae0,0xaa);
  local_1a0 = auVar192._0_8_;
  uStack_198 = local_1a0;
  uStack_190 = local_1a0;
  uStack_188 = local_1a0;
  auVar192 = vshufps_avx(local_ae0,local_ae0,0xff);
  local_340 = auVar192._0_8_;
  uStack_338 = local_340;
  uStack_330 = local_340;
  uStack_328 = local_340;
  auVar192 = vmovshdup_avx(local_b00);
  local_360 = auVar192._0_8_;
  uStack_358 = local_360;
  uStack_350 = local_360;
  uStack_348 = local_360;
  auVar192 = vshufps_avx(local_b00,local_b00,0xaa);
  local_1c0 = auVar192._0_8_;
  uStack_1b8 = local_1c0;
  uStack_1b0 = local_1c0;
  uStack_1a8 = local_1c0;
  auVar192 = vshufps_avx(local_b00,local_b00,0xff);
  local_380 = auVar192._0_8_;
  uStack_378 = local_380;
  uStack_370 = local_380;
  uStack_368 = local_380;
  auVar192 = vmovshdup_avx(local_af0);
  local_1e0 = auVar192._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar192 = vshufps_avx(local_af0,local_af0,0xaa);
  local_200 = auVar192._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar192 = vshufps_avx(local_af0,local_af0,0xff);
  local_3a0 = auVar192._0_8_;
  uStack_398 = local_3a0;
  uStack_390 = local_3a0;
  uStack_388 = local_3a0;
  auVar192 = vmovshdup_avx(_local_b10);
  local_3c0 = auVar192._0_8_;
  uStack_3b8 = local_3c0;
  uStack_3b0 = local_3c0;
  uStack_3a8 = local_3c0;
  auVar192 = vshufps_avx(_local_b10,_local_b10,0xaa);
  local_3e0 = auVar192._0_8_;
  uStack_3d8 = local_3e0;
  uStack_3d0 = local_3e0;
  uStack_3c8 = local_3e0;
  auVar192 = vshufps_avx(_local_b10,_local_b10,0xff);
  local_400 = auVar192._0_8_;
  uStack_3f8 = local_400;
  uStack_3f0 = local_400;
  uStack_3e8 = local_400;
  auVar192 = vfmadd231ps_fma(ZEXT432((uint)(fVar101 * fVar101)),_local_820,_local_820);
  auVar192 = vfmadd231ps_fma(ZEXT1632(auVar192),_local_800,_local_800);
  uVar98 = auVar192._0_4_;
  local_220._4_4_ = uVar98;
  local_220._0_4_ = uVar98;
  local_220._8_4_ = uVar98;
  local_220._12_4_ = uVar98;
  local_220._16_4_ = uVar98;
  local_220._20_4_ = uVar98;
  local_220._24_4_ = uVar98;
  local_220._28_4_ = uVar98;
  auVar216 = ZEXT3264(local_220);
  fVar101 = *(float *)(ray + k * 4 + 0x30);
  local_910 = ZEXT416((uint)local_260);
  local_260 = fVar101 - local_260;
  fStack_25c = local_260;
  fStack_258 = local_260;
  fStack_254 = local_260;
  fStack_250 = local_260;
  fStack_24c = local_260;
  fStack_248 = local_260;
  fStack_244 = local_260;
  uVar99 = 1;
  uVar93 = 0;
  local_420 = local_ae0._0_4_;
  uStack_41c = local_420;
  uStack_418 = local_420;
  uStack_414 = local_420;
  uStack_410 = local_420;
  uStack_40c = local_420;
  uStack_408 = local_420;
  uStack_404 = local_420;
  local_440 = local_b00._0_4_;
  uStack_43c = local_440;
  uStack_438 = local_440;
  uStack_434 = local_440;
  uStack_430 = local_440;
  uStack_42c = local_440;
  uStack_428 = local_440;
  uStack_424 = local_440;
  local_460 = local_af0._0_4_;
  uStack_45c = local_460;
  uStack_458 = local_460;
  uStack_454 = local_460;
  uStack_450 = local_460;
  uStack_44c = local_460;
  uStack_448 = local_460;
  uStack_444 = local_460;
  local_480 = local_b10._0_4_;
  fStack_47c = local_480;
  fStack_478 = local_480;
  fStack_474 = local_480;
  fStack_470 = local_480;
  fStack_46c = local_480;
  fStack_468 = local_480;
  fStack_464 = local_480;
  auVar124._4_4_ = uStack_89c;
  auVar124._0_4_ = local_8a0;
  auVar124._8_4_ = uStack_898;
  auVar124._12_4_ = uStack_894;
  auVar124._16_4_ = uStack_890;
  auVar124._20_4_ = uStack_88c;
  auVar124._24_4_ = uStack_888;
  auVar124._28_4_ = uStack_884;
  local_4a0 = vandps_avx(local_220,auVar124);
  auVar192 = vsqrtss_avx(local_990,local_990);
  local_b44 = auVar192._0_4_;
  auVar192 = vsqrtss_avx(local_990,local_990);
  local_b48 = auVar192._0_4_;
  local_920 = 0x3f80000000000000;
  uStack_918 = 0;
  local_720 = uVar1;
  uStack_71c = uVar1;
  uStack_718 = uVar1;
  uStack_714 = uVar1;
  local_710 = uVar95;
  uStack_70c = uVar95;
  uStack_708 = uVar95;
  uStack_704 = uVar95;
  do {
    auVar62._8_8_ = uStack_918;
    auVar62._0_8_ = local_920;
    auVar192 = vmovshdup_avx(auVar62);
    fVar217 = (float)local_920;
    fVar204 = auVar192._0_4_ - fVar217;
    fVar257 = fVar204 * 0.04761905;
    local_9e0._4_4_ = fVar217;
    local_9e0._0_4_ = fVar217;
    local_9e0._8_4_ = fVar217;
    local_9e0._12_4_ = fVar217;
    local_9e0._16_4_ = fVar217;
    local_9e0._20_4_ = fVar217;
    local_9e0._24_4_ = fVar217;
    local_9e0._28_4_ = fVar217;
    local_960._4_4_ = fVar204;
    local_960._0_4_ = fVar204;
    local_960._8_4_ = fVar204;
    local_960._12_4_ = fVar204;
    local_960._16_4_ = fVar204;
    local_960._20_4_ = fVar204;
    local_960._24_4_ = fVar204;
    local_960._28_4_ = fVar204;
    auVar192 = vfmadd231ps_fma(local_9e0,local_960,_DAT_02020f20);
    auVar118._8_4_ = 0x3f800000;
    auVar118._0_8_ = &DAT_3f8000003f800000;
    auVar118._12_4_ = 0x3f800000;
    auVar118._16_4_ = 0x3f800000;
    auVar118._20_4_ = 0x3f800000;
    auVar118._24_4_ = 0x3f800000;
    auVar118._28_4_ = 0x3f800000;
    auVar117 = vsubps_avx(auVar118,ZEXT1632(auVar192));
    fVar204 = auVar117._0_4_;
    fVar218 = auVar117._4_4_;
    fVar290 = auVar117._8_4_;
    fVar219 = auVar117._12_4_;
    fVar256 = auVar117._16_4_;
    fVar221 = auVar117._20_4_;
    fVar244 = auVar117._24_4_;
    fVar102 = fVar204 * fVar204 * fVar204;
    fVar127 = fVar218 * fVar218 * fVar218;
    fVar128 = fVar290 * fVar290 * fVar290;
    fVar129 = fVar219 * fVar219 * fVar219;
    fVar130 = fVar256 * fVar256 * fVar256;
    fVar131 = fVar221 * fVar221 * fVar221;
    fVar132 = fVar244 * fVar244 * fVar244;
    fVar217 = auVar192._0_4_;
    fVar220 = auVar192._4_4_;
    fVar291 = auVar192._8_4_;
    fVar243 = auVar192._12_4_;
    fVar165 = fVar217 * fVar217 * fVar217;
    fVar181 = fVar220 * fVar220 * fVar220;
    fVar182 = fVar291 * fVar291 * fVar291;
    fVar183 = fVar243 * fVar243 * fVar243;
    fVar258 = fVar204 * fVar217;
    fVar268 = fVar218 * fVar220;
    fVar269 = fVar290 * fVar291;
    fVar270 = fVar219 * fVar243;
    fVar271 = fVar256 * 0.0;
    fVar272 = fVar221 * 0.0;
    fVar273 = fVar244 * 0.0;
    fVar278 = auVar277._28_4_ + auVar289._28_4_;
    auVar6._4_4_ = fVar127 * 0.16666667;
    auVar6._0_4_ = fVar102 * 0.16666667;
    auVar6._8_4_ = fVar128 * 0.16666667;
    auVar6._12_4_ = fVar129 * 0.16666667;
    auVar6._16_4_ = fVar130 * 0.16666667;
    auVar6._20_4_ = fVar131 * 0.16666667;
    auVar6._24_4_ = fVar132 * 0.16666667;
    auVar6._28_4_ = fVar278 + 1.0;
    auVar8._4_4_ = (fVar218 * fVar268 * 12.0 + fVar268 * fVar220 * 6.0 + fVar181 + fVar127 * 4.0) *
                   0.16666667;
    auVar8._0_4_ = (fVar204 * fVar258 * 12.0 + fVar258 * fVar217 * 6.0 + fVar165 + fVar102 * 4.0) *
                   0.16666667;
    auVar8._8_4_ = (fVar290 * fVar269 * 12.0 + fVar269 * fVar291 * 6.0 + fVar182 + fVar128 * 4.0) *
                   0.16666667;
    auVar8._12_4_ =
         (fVar219 * fVar270 * 12.0 + fVar270 * fVar243 * 6.0 + fVar183 + fVar129 * 4.0) * 0.16666667
    ;
    auVar8._16_4_ =
         (fVar256 * fVar271 * 12.0 + fVar271 * 0.0 * 6.0 + fVar130 * 4.0 + 0.0) * 0.16666667;
    auVar8._20_4_ =
         (fVar221 * fVar272 * 12.0 + fVar272 * 0.0 * 6.0 + fVar131 * 4.0 + 0.0) * 0.16666667;
    auVar8._24_4_ =
         (fVar244 * fVar273 * 12.0 + fVar273 * 0.0 * 6.0 + fVar132 * 4.0 + 0.0) * 0.16666667;
    auVar8._28_4_ = auVar283._28_4_;
    auVar252._4_4_ =
         (fVar181 * 4.0 + fVar127 + fVar268 * fVar220 * 12.0 + fVar218 * fVar268 * 6.0) * 0.16666667
    ;
    auVar252._0_4_ =
         (fVar165 * 4.0 + fVar102 + fVar258 * fVar217 * 12.0 + fVar204 * fVar258 * 6.0) * 0.16666667
    ;
    auVar252._8_4_ =
         (fVar182 * 4.0 + fVar128 + fVar269 * fVar291 * 12.0 + fVar290 * fVar269 * 6.0) * 0.16666667
    ;
    auVar252._12_4_ =
         (fVar183 * 4.0 + fVar129 + fVar270 * fVar243 * 12.0 + fVar219 * fVar270 * 6.0) * 0.16666667
    ;
    auVar252._16_4_ = (fVar130 + 0.0 + fVar271 * 0.0 * 12.0 + fVar256 * fVar271 * 6.0) * 0.16666667;
    auVar252._20_4_ = (fVar131 + 0.0 + fVar272 * 0.0 * 12.0 + fVar221 * fVar272 * 6.0) * 0.16666667;
    auVar252._24_4_ = (fVar132 + 0.0 + fVar273 * 0.0 * 12.0 + fVar244 * fVar273 * 6.0) * 0.16666667;
    auVar252._28_4_ = auVar289._28_4_;
    fVar165 = fVar165 * 0.16666667;
    fVar181 = fVar181 * 0.16666667;
    fVar182 = fVar182 * 0.16666667;
    fVar183 = fVar183 * 0.16666667;
    auVar120._4_4_ = fVar181 * fStack_47c;
    auVar120._0_4_ = fVar165 * local_480;
    auVar120._8_4_ = fVar182 * fStack_478;
    auVar120._12_4_ = fVar183 * fStack_474;
    auVar120._16_4_ = fStack_470 * 0.0;
    auVar120._20_4_ = fStack_46c * 0.0;
    auVar120._24_4_ = fStack_468 * 0.0;
    auVar120._28_4_ = 0x40c00000;
    auVar154._4_4_ = fVar181 * local_3c0._4_4_;
    auVar154._0_4_ = fVar165 * (float)local_3c0;
    auVar154._8_4_ = fVar182 * (float)uStack_3b8;
    auVar154._12_4_ = fVar183 * uStack_3b8._4_4_;
    auVar154._16_4_ = (float)uStack_3b0 * 0.0;
    auVar154._20_4_ = uStack_3b0._4_4_ * 0.0;
    auVar154._24_4_ = (float)uStack_3a8 * 0.0;
    auVar154._28_4_ = 0x3e2aaaab;
    auVar240._4_4_ = fVar181 * local_3e0._4_4_;
    auVar240._0_4_ = fVar165 * (float)local_3e0;
    auVar240._8_4_ = fVar182 * (float)uStack_3d8;
    auVar240._12_4_ = fVar183 * uStack_3d8._4_4_;
    auVar240._16_4_ = (float)uStack_3d0 * 0.0;
    auVar240._20_4_ = uStack_3d0._4_4_ * 0.0;
    auVar240._24_4_ = (float)uStack_3c8 * 0.0;
    auVar240._28_4_ = 0x40800000;
    auVar11._4_4_ = fVar181 * local_400._4_4_;
    auVar11._0_4_ = fVar165 * (float)local_400;
    auVar11._8_4_ = fVar182 * (float)uStack_3f8;
    auVar11._12_4_ = fVar183 * uStack_3f8._4_4_;
    auVar11._16_4_ = (float)uStack_3f0 * 0.0;
    auVar11._20_4_ = uStack_3f0._4_4_ * 0.0;
    auVar11._24_4_ = (float)uStack_3e8 * 0.0;
    auVar11._28_4_ = fVar278 + 4.0;
    auVar69._4_4_ = uStack_45c;
    auVar69._0_4_ = local_460;
    auVar69._8_4_ = uStack_458;
    auVar69._12_4_ = uStack_454;
    auVar69._16_4_ = uStack_450;
    auVar69._20_4_ = uStack_44c;
    auVar69._24_4_ = uStack_448;
    auVar69._28_4_ = uStack_444;
    auVar192 = vfmadd231ps_fma(auVar120,auVar252,auVar69);
    auVar87._8_8_ = uStack_1d8;
    auVar87._0_8_ = local_1e0;
    auVar87._16_8_ = uStack_1d0;
    auVar87._24_8_ = uStack_1c8;
    auVar261 = vfmadd231ps_fma(auVar154,auVar252,auVar87);
    auVar86._8_8_ = uStack_1f8;
    auVar86._0_8_ = local_200;
    auVar86._16_8_ = uStack_1f0;
    auVar86._24_8_ = uStack_1e8;
    auVar112 = vfmadd231ps_fma(auVar240,auVar252,auVar86);
    auVar75._8_8_ = uStack_398;
    auVar75._0_8_ = local_3a0;
    auVar75._16_8_ = uStack_390;
    auVar75._24_8_ = uStack_388;
    auVar7 = vfmadd231ps_fma(auVar11,auVar252,auVar75);
    auVar71._4_4_ = uStack_43c;
    auVar71._0_4_ = local_440;
    auVar71._8_4_ = uStack_438;
    auVar71._12_4_ = uStack_434;
    auVar71._16_4_ = uStack_430;
    auVar71._20_4_ = uStack_42c;
    auVar71._24_4_ = uStack_428;
    auVar71._28_4_ = uStack_424;
    auVar192 = vfmadd231ps_fma(ZEXT1632(auVar192),auVar8,auVar71);
    auVar79._8_8_ = uStack_358;
    auVar79._0_8_ = local_360;
    auVar79._16_8_ = uStack_350;
    auVar79._24_8_ = uStack_348;
    auVar261 = vfmadd231ps_fma(ZEXT1632(auVar261),auVar8,auVar79);
    auVar88._8_8_ = uStack_1b8;
    auVar88._0_8_ = local_1c0;
    auVar88._16_8_ = uStack_1b0;
    auVar88._24_8_ = uStack_1a8;
    auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar8,auVar88);
    auVar77._8_8_ = uStack_378;
    auVar77._0_8_ = local_380;
    auVar77._16_8_ = uStack_370;
    auVar77._24_8_ = uStack_368;
    auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar8,auVar77);
    auVar73._4_4_ = uStack_41c;
    auVar73._0_4_ = local_420;
    auVar73._8_4_ = uStack_418;
    auVar73._12_4_ = uStack_414;
    auVar73._16_4_ = uStack_410;
    auVar73._20_4_ = uStack_40c;
    auVar73._24_4_ = uStack_408;
    auVar73._28_4_ = uStack_404;
    auVar298 = vfmadd231ps_fma(ZEXT1632(auVar192),auVar6,auVar73);
    auVar83._8_8_ = uStack_318;
    auVar83._0_8_ = local_320;
    auVar83._16_8_ = uStack_310;
    auVar83._24_8_ = uStack_308;
    auVar261 = vfmadd231ps_fma(ZEXT1632(auVar261),auVar6,auVar83);
    auVar89._8_8_ = uStack_198;
    auVar89._0_8_ = local_1a0;
    auVar89._16_8_ = uStack_190;
    auVar89._24_8_ = uStack_188;
    auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar6,auVar89);
    auVar81._8_8_ = uStack_338;
    auVar81._0_8_ = local_340;
    auVar81._16_8_ = uStack_330;
    auVar81._24_8_ = uStack_328;
    auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar6,auVar81);
    auVar233._0_4_ = (float)((uint)fVar217 ^ local_620) * fVar217;
    auVar233._4_4_ = (float)((uint)fVar220 ^ uStack_61c) * fVar220;
    auVar233._8_4_ = (float)((uint)fVar291 ^ uStack_618) * fVar291;
    auVar233._12_4_ = (float)((uint)fVar243 ^ uStack_614) * fVar243;
    auVar233._16_4_ = fStack_610 * 0.0;
    auVar233._20_4_ = fStack_60c * 0.0;
    auVar233._24_4_ = fStack_608 * 0.0;
    auVar233._28_4_ = 0;
    auVar266._4_4_ = fVar268 * 4.0;
    auVar266._0_4_ = fVar258 * 4.0;
    auVar266._8_4_ = fVar269 * 4.0;
    auVar266._12_4_ = fVar270 * 4.0;
    auVar266._16_4_ = fVar271 * 4.0;
    auVar266._20_4_ = fVar272 * 4.0;
    fVar102 = auVar267._28_4_;
    auVar266._24_4_ = fVar273 * 4.0;
    auVar266._28_4_ = fVar102;
    auVar124 = vsubps_avx(auVar233,auVar266);
    auVar276._4_4_ = fVar218 * (float)((uint)fVar218 ^ uStack_61c) * 0.5;
    auVar276._0_4_ = fVar204 * (float)((uint)fVar204 ^ local_620) * 0.5;
    auVar276._8_4_ = fVar290 * (float)((uint)fVar290 ^ uStack_618) * 0.5;
    auVar276._12_4_ = fVar219 * (float)((uint)fVar219 ^ uStack_614) * 0.5;
    auVar276._16_4_ = fVar256 * (float)((uint)fVar256 ^ (uint)fStack_610) * 0.5;
    auVar276._20_4_ = fVar221 * (float)((uint)fVar221 ^ (uint)fStack_60c) * 0.5;
    auVar276._24_4_ = fVar244 * (float)((uint)fVar244 ^ (uint)fStack_608) * 0.5;
    auVar276._28_4_ = auVar117._28_4_;
    auVar239._4_4_ = auVar124._4_4_ * 0.5;
    auVar239._0_4_ = auVar124._0_4_ * 0.5;
    auVar239._8_4_ = auVar124._8_4_ * 0.5;
    auVar239._12_4_ = auVar124._12_4_ * 0.5;
    auVar239._16_4_ = auVar124._16_4_ * 0.5;
    auVar239._20_4_ = auVar124._20_4_ * 0.5;
    auVar239._24_4_ = auVar124._24_4_ * 0.5;
    auVar239._28_4_ = auVar124._28_4_;
    auVar9._4_4_ = (fVar268 * 4.0 + fVar218 * fVar218) * 0.5;
    auVar9._0_4_ = (fVar258 * 4.0 + fVar204 * fVar204) * 0.5;
    auVar9._8_4_ = (fVar269 * 4.0 + fVar290 * fVar290) * 0.5;
    auVar9._12_4_ = (fVar270 * 4.0 + fVar219 * fVar219) * 0.5;
    auVar9._16_4_ = (fVar271 * 4.0 + fVar256 * fVar256) * 0.5;
    auVar9._20_4_ = (fVar272 * 4.0 + fVar221 * fVar221) * 0.5;
    auVar9._24_4_ = (fVar273 * 4.0 + fVar244 * fVar244) * 0.5;
    auVar9._28_4_ = fVar102 + auVar242._28_4_;
    fVar204 = fVar217 * fVar217 * 0.5;
    fVar217 = fVar220 * fVar220 * 0.5;
    fVar218 = fVar291 * fVar291 * 0.5;
    fVar220 = fVar243 * fVar243 * 0.5;
    auVar13._4_4_ = fVar217 * fStack_47c;
    auVar13._0_4_ = fVar204 * local_480;
    auVar13._8_4_ = fVar218 * fStack_478;
    auVar13._12_4_ = fVar220 * fStack_474;
    auVar13._16_4_ = fStack_470 * 0.0;
    auVar13._20_4_ = fStack_46c * 0.0;
    auVar13._24_4_ = fStack_468 * 0.0;
    auVar13._28_4_ = fVar102;
    auVar14._4_4_ = fVar217 * local_3c0._4_4_;
    auVar14._0_4_ = fVar204 * (float)local_3c0;
    auVar14._8_4_ = fVar218 * (float)uStack_3b8;
    auVar14._12_4_ = fVar220 * uStack_3b8._4_4_;
    auVar14._16_4_ = (float)uStack_3b0 * 0.0;
    auVar14._20_4_ = uStack_3b0._4_4_ * 0.0;
    auVar14._24_4_ = (float)uStack_3a8 * 0.0;
    auVar14._28_4_ = uStack_604;
    auVar15._4_4_ = fVar217 * local_3e0._4_4_;
    auVar15._0_4_ = fVar204 * (float)local_3e0;
    auVar15._8_4_ = fVar218 * (float)uStack_3d8;
    auVar15._12_4_ = fVar220 * uStack_3d8._4_4_;
    auVar15._16_4_ = (float)uStack_3d0 * 0.0;
    auVar15._20_4_ = uStack_3d0._4_4_ * 0.0;
    auVar15._24_4_ = (float)uStack_3c8 * 0.0;
    auVar15._28_4_ = auVar283._28_4_;
    auVar16._4_4_ = fVar217 * local_400._4_4_;
    auVar16._0_4_ = fVar204 * (float)local_400;
    auVar16._8_4_ = fVar218 * (float)uStack_3f8;
    auVar16._12_4_ = fVar220 * uStack_3f8._4_4_;
    auVar16._16_4_ = (float)uStack_3f0 * 0.0;
    auVar16._20_4_ = uStack_3f0._4_4_ * 0.0;
    auVar16._24_4_ = (float)uStack_3e8 * 0.0;
    auVar16._28_4_ = auVar216._28_4_;
    auVar70._4_4_ = uStack_45c;
    auVar70._0_4_ = local_460;
    auVar70._8_4_ = uStack_458;
    auVar70._12_4_ = uStack_454;
    auVar70._16_4_ = uStack_450;
    auVar70._20_4_ = uStack_44c;
    auVar70._24_4_ = uStack_448;
    auVar70._28_4_ = uStack_444;
    auVar192 = vfmadd231ps_fma(auVar13,auVar9,auVar70);
    auVar292 = vfmadd231ps_fma(auVar14,auVar9,auVar87);
    auVar106 = vfmadd231ps_fma(auVar15,auVar9,auVar86);
    auVar76._8_8_ = uStack_398;
    auVar76._0_8_ = local_3a0;
    auVar76._16_8_ = uStack_390;
    auVar76._24_8_ = uStack_388;
    auVar105 = vfmadd231ps_fma(auVar16,auVar9,auVar76);
    auVar72._4_4_ = uStack_43c;
    auVar72._0_4_ = local_440;
    auVar72._8_4_ = uStack_438;
    auVar72._12_4_ = uStack_434;
    auVar72._16_4_ = uStack_430;
    auVar72._20_4_ = uStack_42c;
    auVar72._24_4_ = uStack_428;
    auVar72._28_4_ = uStack_424;
    auVar192 = vfmadd231ps_fma(ZEXT1632(auVar192),auVar239,auVar72);
    auVar80._8_8_ = uStack_358;
    auVar80._0_8_ = local_360;
    auVar80._16_8_ = uStack_350;
    auVar80._24_8_ = uStack_348;
    auVar292 = vfmadd231ps_fma(ZEXT1632(auVar292),auVar239,auVar80);
    auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar239,auVar88);
    auVar78._8_8_ = uStack_378;
    auVar78._0_8_ = local_380;
    auVar78._16_8_ = uStack_370;
    auVar78._24_8_ = uStack_368;
    auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar239,auVar78);
    auVar74._4_4_ = uStack_41c;
    auVar74._0_4_ = local_420;
    auVar74._8_4_ = uStack_418;
    auVar74._12_4_ = uStack_414;
    auVar74._16_4_ = uStack_410;
    auVar74._20_4_ = uStack_40c;
    auVar74._24_4_ = uStack_408;
    auVar74._28_4_ = uStack_404;
    auVar192 = vfmadd231ps_fma(ZEXT1632(auVar192),auVar276,auVar74);
    auVar84._8_8_ = uStack_318;
    auVar84._0_8_ = local_320;
    auVar84._16_8_ = uStack_310;
    auVar84._24_8_ = uStack_308;
    auVar292 = vfmadd231ps_fma(ZEXT1632(auVar292),auVar276,auVar84);
    auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar276,auVar89);
    auVar82._8_8_ = uStack_338;
    auVar82._0_8_ = local_340;
    auVar82._16_8_ = uStack_330;
    auVar82._24_8_ = uStack_328;
    auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar276,auVar82);
    auVar263._0_4_ = auVar192._0_4_ * fVar257;
    auVar263._4_4_ = auVar192._4_4_ * fVar257;
    auVar263._8_4_ = auVar192._8_4_ * fVar257;
    auVar263._12_4_ = auVar192._12_4_ * fVar257;
    auVar263._16_4_ = fVar257 * 0.0;
    auVar263._20_4_ = fVar257 * 0.0;
    auVar263._24_4_ = fVar257 * 0.0;
    local_940._28_4_ = 0;
    local_940._0_28_ = auVar263;
    fVar217 = auVar292._0_4_ * fVar257;
    fVar218 = auVar292._4_4_ * fVar257;
    local_a60._4_4_ = fVar218;
    local_a60._0_4_ = fVar217;
    fVar290 = auVar292._8_4_ * fVar257;
    local_a60._8_4_ = fVar290;
    fVar291 = auVar292._12_4_ * fVar257;
    local_a60._12_4_ = fVar291;
    local_a60._16_4_ = fVar257 * 0.0;
    local_a60._20_4_ = fVar257 * 0.0;
    local_a60._24_4_ = fVar257 * 0.0;
    local_a60._28_4_ = (int)((ulong)uStack_188 >> 0x20);
    local_740._0_4_ = auVar106._0_4_ * fVar257;
    local_740._4_4_ = auVar106._4_4_ * fVar257;
    local_740._8_4_ = auVar106._8_4_ * fVar257;
    local_740._12_4_ = auVar106._12_4_ * fVar257;
    local_740._16_4_ = fVar257 * 0.0;
    local_740._20_4_ = fVar257 * 0.0;
    local_740._24_4_ = fVar257 * 0.0;
    local_740._28_4_ = 0;
    auVar213._0_4_ = fVar257 * auVar105._0_4_;
    auVar213._4_4_ = fVar257 * auVar105._4_4_;
    auVar213._8_4_ = fVar257 * auVar105._8_4_;
    auVar213._12_4_ = fVar257 * auVar105._12_4_;
    auVar213._16_4_ = fVar257 * 0.0;
    auVar213._20_4_ = fVar257 * 0.0;
    auVar213._24_4_ = fVar257 * 0.0;
    auVar213._28_4_ = 0;
    auVar154 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar298));
    auVar240 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar261));
    _local_a40 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar112));
    local_580 = vsubps_avx(auVar154,ZEXT1632(auVar298));
    local_5c0 = vsubps_avx(_local_a40,ZEXT1632(auVar112));
    fVar204 = local_5c0._0_4_;
    fVar220 = local_5c0._4_4_;
    auVar17._4_4_ = auVar263._4_4_ * fVar220;
    auVar17._0_4_ = auVar263._0_4_ * fVar204;
    fVar219 = local_5c0._8_4_;
    auVar17._8_4_ = auVar263._8_4_ * fVar219;
    fVar221 = local_5c0._12_4_;
    auVar17._12_4_ = auVar263._12_4_ * fVar221;
    fVar102 = local_5c0._16_4_;
    auVar17._16_4_ = auVar263._16_4_ * fVar102;
    fVar128 = local_5c0._20_4_;
    auVar17._20_4_ = auVar263._20_4_ * fVar128;
    fVar130 = local_5c0._24_4_;
    auVar17._24_4_ = auVar263._24_4_ * fVar130;
    auVar17._28_4_ = auVar124._28_4_;
    auVar192 = vfmsub231ps_fma(auVar17,local_740,local_580);
    local_5a0 = vsubps_avx(auVar240,ZEXT1632(auVar261));
    fVar273 = local_580._0_4_;
    fVar278 = local_580._4_4_;
    auVar18._4_4_ = fVar278 * fVar218;
    auVar18._0_4_ = fVar273 * fVar217;
    fVar300 = local_580._8_4_;
    auVar18._8_4_ = fVar300 * fVar290;
    fVar301 = local_580._12_4_;
    auVar18._12_4_ = fVar301 * fVar291;
    fVar302 = local_580._16_4_;
    auVar18._16_4_ = fVar302 * fVar257 * 0.0;
    fVar303 = local_580._20_4_;
    auVar18._20_4_ = fVar303 * fVar257 * 0.0;
    fVar304 = local_580._24_4_;
    auVar18._24_4_ = fVar304 * fVar257 * 0.0;
    auVar18._28_4_ = auVar154._28_4_;
    auVar292 = vfmsub231ps_fma(auVar18,local_940,local_5a0);
    auVar192 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar292._12_4_ * auVar292._12_4_,
                                                  CONCAT48(auVar292._8_4_ * auVar292._8_4_,
                                                           CONCAT44(auVar292._4_4_ * auVar292._4_4_,
                                                                    auVar292._0_4_ * auVar292._0_4_)
                                                          ))),ZEXT1632(auVar192),ZEXT1632(auVar192))
    ;
    fVar182 = local_5a0._0_4_;
    fVar183 = local_5a0._4_4_;
    auVar19._4_4_ = fVar183 * local_740._4_4_;
    auVar19._0_4_ = fVar182 * local_740._0_4_;
    fVar258 = local_5a0._8_4_;
    auVar19._8_4_ = fVar258 * local_740._8_4_;
    fVar268 = local_5a0._12_4_;
    auVar19._12_4_ = fVar268 * local_740._12_4_;
    fVar269 = local_5a0._16_4_;
    auVar19._16_4_ = fVar269 * local_740._16_4_;
    fVar270 = local_5a0._20_4_;
    auVar19._20_4_ = fVar270 * local_740._20_4_;
    fVar271 = local_5a0._24_4_;
    auVar19._24_4_ = fVar271 * local_740._24_4_;
    auVar19._28_4_ = auVar240._28_4_;
    auVar106 = vfmsub231ps_fma(auVar19,local_a60,local_5c0);
    auVar234._0_4_ = fVar204 * fVar204;
    auVar234._4_4_ = fVar220 * fVar220;
    auVar234._8_4_ = fVar219 * fVar219;
    auVar234._12_4_ = fVar221 * fVar221;
    auVar234._16_4_ = fVar102 * fVar102;
    auVar234._20_4_ = fVar128 * fVar128;
    auVar234._24_4_ = fVar130 * fVar130;
    auVar234._28_4_ = 0;
    auVar292 = vfmadd231ps_fma(auVar234,local_5a0,local_5a0);
    auVar292 = vfmadd231ps_fma(ZEXT1632(auVar292),local_580,local_580);
    auVar117 = vrcpps_avx(ZEXT1632(auVar292));
    auVar106 = vfmadd231ps_fma(ZEXT1632(auVar192),ZEXT1632(auVar106),ZEXT1632(auVar106));
    auVar230._8_4_ = 0x3f800000;
    auVar230._0_8_ = &DAT_3f8000003f800000;
    auVar230._12_4_ = 0x3f800000;
    auVar230._16_4_ = 0x3f800000;
    auVar230._20_4_ = 0x3f800000;
    auVar230._24_4_ = 0x3f800000;
    auVar230._28_4_ = 0x3f800000;
    auVar192 = vfnmadd213ps_fma(auVar117,ZEXT1632(auVar292),auVar230);
    auVar192 = vfmadd132ps_fma(ZEXT1632(auVar192),auVar117,auVar117);
    local_a80 = vpermps_avx2(_DAT_0205d4a0,local_940);
    local_9c0 = vpermps_avx2(_DAT_0205d4a0,local_740);
    auVar90._4_4_ = fVar220 * local_a80._4_4_;
    auVar90._0_4_ = fVar204 * local_a80._0_4_;
    auVar90._8_4_ = fVar219 * local_a80._8_4_;
    auVar90._12_4_ = fVar221 * local_a80._12_4_;
    auVar90._16_4_ = fVar102 * local_a80._16_4_;
    auVar90._20_4_ = fVar128 * local_a80._20_4_;
    auVar90._24_4_ = fVar130 * local_a80._24_4_;
    auVar90._28_4_ = DAT_0205d4a0._28_4_;
    auVar105 = vfmsub231ps_fma(auVar90,local_9c0,local_580);
    local_aa0 = vpermps_avx2(_DAT_0205d4a0,local_a60);
    auVar20._4_4_ = fVar278 * local_aa0._4_4_;
    auVar20._0_4_ = fVar273 * local_aa0._0_4_;
    auVar20._8_4_ = fVar300 * local_aa0._8_4_;
    auVar20._12_4_ = fVar301 * local_aa0._12_4_;
    auVar20._16_4_ = fVar302 * local_aa0._16_4_;
    auVar20._20_4_ = fVar303 * local_aa0._20_4_;
    auVar20._24_4_ = fVar304 * local_aa0._24_4_;
    auVar20._28_4_ = DAT_0205d4a0._28_4_;
    auVar138 = vfmsub231ps_fma(auVar20,local_a80,local_5a0);
    auVar105 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar138._12_4_ * auVar138._12_4_,
                                                  CONCAT48(auVar138._8_4_ * auVar138._8_4_,
                                                           CONCAT44(auVar138._4_4_ * auVar138._4_4_,
                                                                    auVar138._0_4_ * auVar138._0_4_)
                                                          ))),ZEXT1632(auVar105),ZEXT1632(auVar105))
    ;
    fVar217 = local_9c0._0_4_;
    auVar248._0_4_ = fVar182 * fVar217;
    fVar290 = local_9c0._4_4_;
    auVar248._4_4_ = fVar183 * fVar290;
    fVar243 = local_9c0._8_4_;
    auVar248._8_4_ = fVar258 * fVar243;
    fVar244 = local_9c0._12_4_;
    auVar248._12_4_ = fVar268 * fVar244;
    fVar127 = local_9c0._16_4_;
    auVar248._16_4_ = fVar269 * fVar127;
    fVar129 = local_9c0._20_4_;
    auVar248._20_4_ = fVar270 * fVar129;
    fVar131 = local_9c0._24_4_;
    auVar248._24_4_ = fVar271 * fVar131;
    auVar248._28_4_ = 0;
    auVar138 = vfmsub231ps_fma(auVar248,local_aa0,local_5c0);
    auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),ZEXT1632(auVar138),ZEXT1632(auVar138));
    auVar117 = vmaxps_avx(ZEXT1632(CONCAT412(auVar106._12_4_ * auVar192._12_4_,
                                             CONCAT48(auVar106._8_4_ * auVar192._8_4_,
                                                      CONCAT44(auVar106._4_4_ * auVar192._4_4_,
                                                               auVar106._0_4_ * auVar192._0_4_)))),
                          ZEXT1632(CONCAT412(auVar105._12_4_ * auVar192._12_4_,
                                             CONCAT48(auVar105._8_4_ * auVar192._8_4_,
                                                      CONCAT44(auVar105._4_4_ * auVar192._4_4_,
                                                               auVar105._0_4_ * auVar192._0_4_)))));
    local_780._0_4_ = auVar213._0_4_ + auVar7._0_4_;
    local_780._4_4_ = auVar213._4_4_ + auVar7._4_4_;
    local_780._8_4_ = auVar213._8_4_ + auVar7._8_4_;
    local_780._12_4_ = auVar213._12_4_ + auVar7._12_4_;
    local_780._16_4_ = auVar213._16_4_ + 0.0;
    local_780._20_4_ = auVar213._20_4_ + 0.0;
    local_780._24_4_ = auVar213._24_4_ + 0.0;
    local_780._28_4_ = 0;
    auVar124 = vsubps_avx(ZEXT1632(auVar7),auVar213);
    local_7a0 = vpermps_avx2(_DAT_0205d4a0,auVar124);
    local_760 = ZEXT1632(auVar7);
    auVar11 = vpermps_avx2(_DAT_0205d4a0,local_760);
    auVar124 = vmaxps_avx(local_760,local_780);
    auVar6 = vmaxps_avx(local_7a0,auVar11);
    auVar8 = vrsqrtps_avx(ZEXT1632(auVar292));
    auVar6 = vmaxps_avx(auVar124,auVar6);
    uVar98 = auVar124._28_4_;
    fVar218 = auVar8._0_4_;
    fVar291 = auVar8._4_4_;
    fVar256 = auVar8._8_4_;
    fVar257 = auVar8._12_4_;
    fVar132 = auVar8._16_4_;
    fVar165 = auVar8._20_4_;
    fVar181 = auVar8._24_4_;
    auVar264._0_4_ = fVar218 * fVar218 * fVar218 * auVar292._0_4_ * -0.5;
    auVar264._4_4_ = fVar291 * fVar291 * fVar291 * auVar292._4_4_ * -0.5;
    auVar264._8_4_ = fVar256 * fVar256 * fVar256 * auVar292._8_4_ * -0.5;
    auVar264._12_4_ = fVar257 * fVar257 * fVar257 * auVar292._12_4_ * -0.5;
    auVar264._16_4_ = fVar132 * fVar132 * fVar132 * -0.0;
    auVar264._20_4_ = fVar165 * fVar165 * fVar165 * -0.0;
    auVar264._24_4_ = fVar181 * fVar181 * fVar181 * -0.0;
    auVar264._28_4_ = 0;
    auVar119._8_4_ = 0x3fc00000;
    auVar119._0_8_ = 0x3fc000003fc00000;
    auVar119._12_4_ = 0x3fc00000;
    auVar119._16_4_ = 0x3fc00000;
    auVar119._20_4_ = 0x3fc00000;
    auVar119._24_4_ = 0x3fc00000;
    auVar119._28_4_ = 0x3fc00000;
    auVar192 = vfmadd231ps_fma(auVar264,auVar119,auVar8);
    fVar218 = auVar192._0_4_;
    fVar291 = auVar192._4_4_;
    auVar21._4_4_ = fVar183 * fVar291;
    auVar21._0_4_ = fVar182 * fVar218;
    fVar256 = auVar192._8_4_;
    auVar21._8_4_ = fVar258 * fVar256;
    fVar257 = auVar192._12_4_;
    auVar21._12_4_ = fVar268 * fVar257;
    auVar21._16_4_ = fVar269 * 0.0;
    auVar21._20_4_ = fVar270 * 0.0;
    auVar21._24_4_ = fVar271 * 0.0;
    auVar21._28_4_ = uVar98;
    auVar22._4_4_ = (float)local_880._4_4_ * fVar291 * fVar220;
    auVar22._0_4_ = (float)local_880._0_4_ * fVar218 * fVar204;
    auVar22._8_4_ = fStack_878 * fVar256 * fVar219;
    auVar22._12_4_ = fStack_874 * fVar257 * fVar221;
    auVar22._16_4_ = fStack_870 * fVar102 * 0.0;
    auVar22._20_4_ = fStack_86c * fVar128 * 0.0;
    auVar22._24_4_ = fStack_868 * fVar130 * 0.0;
    auVar22._28_4_ = local_5a0._28_4_;
    auVar7 = vfmadd231ps_fma(auVar22,auVar21,_local_820);
    auVar289 = ZEXT864(0) << 0x20;
    _local_660 = ZEXT1632(auVar112);
    auVar124 = vsubps_avx(ZEXT832(0) << 0x20,_local_660);
    auVar283 = ZEXT3264(auVar124);
    fVar183 = auVar124._0_4_;
    auVar265._0_4_ = fVar183 * fVar218 * fVar204;
    fVar258 = auVar124._4_4_;
    auVar265._4_4_ = fVar258 * fVar291 * fVar220;
    fVar268 = auVar124._8_4_;
    auVar265._8_4_ = fVar268 * fVar256 * fVar219;
    fVar269 = auVar124._12_4_;
    auVar265._12_4_ = fVar269 * fVar257 * fVar221;
    fVar270 = auVar124._16_4_;
    auVar265._16_4_ = fVar270 * fVar102 * 0.0;
    fVar271 = auVar124._20_4_;
    auVar265._20_4_ = fVar271 * fVar128 * 0.0;
    fVar272 = auVar124._24_4_;
    auVar265._24_4_ = fVar272 * fVar130 * 0.0;
    auVar265._28_4_ = 0;
    local_540 = ZEXT1632(auVar261);
    auVar8 = vsubps_avx(ZEXT832(0) << 0x20,local_540);
    auVar261 = vfmadd231ps_fma(auVar265,auVar8,auVar21);
    auVar23._4_4_ = fVar278 * fVar291;
    auVar23._0_4_ = fVar273 * fVar218;
    auVar23._8_4_ = fVar300 * fVar256;
    auVar23._12_4_ = fVar301 * fVar257;
    auVar23._16_4_ = fVar302 * 0.0;
    auVar23._20_4_ = fVar303 * 0.0;
    auVar23._24_4_ = fVar304 * 0.0;
    auVar23._28_4_ = uVar98;
    auVar112 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar23,_local_800);
    auVar277 = ZEXT1664(auVar112);
    local_560 = ZEXT1632(auVar298);
    auVar239 = ZEXT832(0) << 0x20;
    auVar252 = vsubps_avx(auVar239,local_560);
    auVar261 = vfmadd231ps_fma(ZEXT1632(auVar261),auVar252,auVar23);
    auVar267 = ZEXT1664(auVar261);
    auVar24._4_4_ = (float)local_880._4_4_ * fVar258;
    auVar24._0_4_ = (float)local_880._0_4_ * fVar183;
    auVar24._8_4_ = fStack_878 * fVar268;
    auVar24._12_4_ = fStack_874 * fVar269;
    auVar24._16_4_ = fStack_870 * fVar270;
    auVar24._20_4_ = fStack_86c * fVar271;
    auVar24._24_4_ = fStack_868 * fVar272;
    auVar24._28_4_ = uVar98;
    auVar7 = vfmadd231ps_fma(auVar24,_local_820,auVar8);
    auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),_local_800,auVar252);
    fVar204 = auVar261._0_4_;
    fVar132 = auVar112._0_4_;
    fVar220 = auVar261._4_4_;
    fVar165 = auVar112._4_4_;
    fVar219 = auVar261._8_4_;
    fVar181 = auVar112._8_4_;
    fVar221 = auVar261._12_4_;
    fVar182 = auVar112._12_4_;
    auVar25._28_4_ = uStack_864;
    auVar25._0_28_ =
         ZEXT1628(CONCAT412(fVar182 * fVar221,
                            CONCAT48(fVar181 * fVar219,CONCAT44(fVar165 * fVar220,fVar132 * fVar204)
                                    )));
    auVar120 = vsubps_avx(ZEXT1632(auVar7),auVar25);
    auVar26._4_4_ = fVar258 * fVar258;
    auVar26._0_4_ = fVar183 * fVar183;
    auVar26._8_4_ = fVar268 * fVar268;
    auVar26._12_4_ = fVar269 * fVar269;
    auVar26._16_4_ = fVar270 * fVar270;
    auVar26._20_4_ = fVar271 * fVar271;
    auVar26._24_4_ = fVar272 * fVar272;
    auVar26._28_4_ = uStack_864;
    auVar7 = vfmadd231ps_fma(auVar26,auVar8,auVar8);
    auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar252,auVar252);
    local_640 = vsubps_avx(ZEXT1632(auVar7),
                           ZEXT1632(CONCAT412(fVar221 * fVar221,
                                              CONCAT48(fVar219 * fVar219,
                                                       CONCAT44(fVar220 * fVar220,fVar204 * fVar204)
                                                      ))));
    auVar124 = vsqrtps_avx(auVar117);
    fVar204 = (auVar124._0_4_ + auVar6._0_4_) * 1.0000002;
    fVar220 = (auVar124._4_4_ + auVar6._4_4_) * 1.0000002;
    fVar219 = (auVar124._8_4_ + auVar6._8_4_) * 1.0000002;
    fVar221 = (auVar124._12_4_ + auVar6._12_4_) * 1.0000002;
    fVar102 = (auVar124._16_4_ + auVar6._16_4_) * 1.0000002;
    fVar128 = (auVar124._20_4_ + auVar6._20_4_) * 1.0000002;
    fVar130 = (auVar124._24_4_ + auVar6._24_4_) * 1.0000002;
    auVar27._4_4_ = fVar220 * fVar220;
    auVar27._0_4_ = fVar204 * fVar204;
    auVar27._8_4_ = fVar219 * fVar219;
    auVar27._12_4_ = fVar221 * fVar221;
    auVar27._16_4_ = fVar102 * fVar102;
    auVar27._20_4_ = fVar128 * fVar128;
    auVar27._24_4_ = fVar130 * fVar130;
    auVar27._28_4_ = auVar124._28_4_ + auVar6._28_4_;
    local_b40._0_4_ = auVar120._0_4_ + auVar120._0_4_;
    local_b40._4_4_ = auVar120._4_4_ + auVar120._4_4_;
    local_b40._8_4_ = auVar120._8_4_ + auVar120._8_4_;
    local_b40._12_4_ = auVar120._12_4_ + auVar120._12_4_;
    local_b40._16_4_ = auVar120._16_4_ + auVar120._16_4_;
    local_b40._20_4_ = auVar120._20_4_ + auVar120._20_4_;
    local_b40._24_4_ = auVar120._24_4_ + auVar120._24_4_;
    fVar204 = auVar120._28_4_;
    local_b40._28_4_ = fVar204 + fVar204;
    auVar6 = vsubps_avx(local_640,auVar27);
    auVar242 = ZEXT3264(auVar6);
    auVar276 = ZEXT1632(auVar112);
    local_a00 = ZEXT1632(CONCAT412(fVar182 * fVar182,
                                   CONCAT48(fVar181 * fVar181,
                                            CONCAT44(fVar165 * fVar165,fVar132 * fVar132))));
    local_4c0 = vsubps_avx(local_220,local_a00);
    auVar28._4_4_ = local_b40._4_4_ * local_b40._4_4_;
    auVar28._0_4_ = local_b40._0_4_ * local_b40._0_4_;
    auVar28._8_4_ = local_b40._8_4_ * local_b40._8_4_;
    auVar28._12_4_ = local_b40._12_4_ * local_b40._12_4_;
    auVar28._16_4_ = local_b40._16_4_ * local_b40._16_4_;
    auVar28._20_4_ = local_b40._20_4_ * local_b40._20_4_;
    auVar28._24_4_ = local_b40._24_4_ * local_b40._24_4_;
    auVar28._28_4_ = local_640._28_4_;
    fVar220 = local_4c0._0_4_;
    fVar219 = local_4c0._4_4_;
    fVar221 = local_4c0._8_4_;
    fVar102 = local_4c0._12_4_;
    fVar128 = local_4c0._16_4_;
    fVar130 = local_4c0._20_4_;
    fVar132 = local_4c0._24_4_;
    auVar29._4_4_ = fVar219 * 4.0 * auVar6._4_4_;
    auVar29._0_4_ = fVar220 * 4.0 * auVar6._0_4_;
    auVar29._8_4_ = fVar221 * 4.0 * auVar6._8_4_;
    auVar29._12_4_ = fVar102 * 4.0 * auVar6._12_4_;
    auVar29._16_4_ = fVar128 * 4.0 * auVar6._16_4_;
    auVar29._20_4_ = fVar130 * 4.0 * auVar6._20_4_;
    auVar29._24_4_ = fVar132 * 4.0 * auVar6._24_4_;
    auVar29._28_4_ = fVar204;
    auVar120 = vsubps_avx(auVar28,auVar29);
    auVar117 = vcmpps_avx(auVar120,auVar239,5);
    auVar266 = ZEXT1632(auVar261);
    fVar204 = local_4c0._28_4_;
    if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar117 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar117 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar117 >> 0x7f,0) == '\0') &&
          (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar117 >> 0xbf,0) == '\0') &&
        (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar117[0x1f])
    {
      local_c00._8_4_ = 0x7f800000;
      local_c00._0_8_ = 0x7f8000007f800000;
      local_c00._12_4_ = 0x7f800000;
      local_c00._16_4_ = 0x7f800000;
      local_c00._20_4_ = 0x7f800000;
      local_c00._24_4_ = 0x7f800000;
      local_c00._28_4_ = 0x7f800000;
      auVar200._8_4_ = 0xff800000;
      auVar200._0_8_ = 0xff800000ff800000;
      auVar200._12_4_ = 0xff800000;
      auVar200._16_4_ = 0xff800000;
      auVar200._20_4_ = 0xff800000;
      auVar200._24_4_ = 0xff800000;
      auVar200._28_4_ = 0xff800000;
    }
    else {
      auVar239 = vcmpps_avx(auVar120,auVar239,5);
      auVar9 = vsqrtps_avx(auVar120);
      auVar293._0_4_ = fVar220 + fVar220;
      auVar293._4_4_ = fVar219 + fVar219;
      auVar293._8_4_ = fVar221 + fVar221;
      auVar293._12_4_ = fVar102 + fVar102;
      auVar293._16_4_ = fVar128 + fVar128;
      auVar293._20_4_ = fVar130 + fVar130;
      auVar293._24_4_ = fVar132 + fVar132;
      auVar293._28_4_ = fVar204 + fVar204;
      auVar120 = vrcpps_avx(auVar293);
      auVar149._8_4_ = 0x3f800000;
      auVar149._0_8_ = &DAT_3f8000003f800000;
      auVar149._12_4_ = 0x3f800000;
      auVar149._16_4_ = 0x3f800000;
      auVar149._20_4_ = 0x3f800000;
      auVar149._24_4_ = 0x3f800000;
      auVar149._28_4_ = 0x3f800000;
      auVar261 = vfnmadd213ps_fma(auVar293,auVar120,auVar149);
      auVar261 = vfmadd132ps_fma(ZEXT1632(auVar261),auVar120,auVar120);
      auVar284._0_4_ = (uint)local_b40._0_4_ ^ local_620;
      auVar284._4_4_ = (uint)local_b40._4_4_ ^ uStack_61c;
      auVar284._8_4_ = (uint)local_b40._8_4_ ^ uStack_618;
      auVar284._12_4_ = (uint)local_b40._12_4_ ^ uStack_614;
      auVar284._16_4_ = (uint)local_b40._16_4_ ^ (uint)fStack_610;
      auVar284._20_4_ = (uint)local_b40._20_4_ ^ (uint)fStack_60c;
      auVar284._24_4_ = (uint)local_b40._24_4_ ^ (uint)fStack_608;
      auVar284._28_4_ = (uint)local_b40._28_4_ ^ uStack_604;
      auVar120 = vsubps_avx(auVar284,auVar9);
      auVar30._4_4_ = auVar120._4_4_ * auVar261._4_4_;
      auVar30._0_4_ = auVar120._0_4_ * auVar261._0_4_;
      auVar30._8_4_ = auVar120._8_4_ * auVar261._8_4_;
      auVar30._12_4_ = auVar120._12_4_ * auVar261._12_4_;
      auVar30._16_4_ = auVar120._16_4_ * 0.0;
      auVar30._20_4_ = auVar120._20_4_ * 0.0;
      auVar30._24_4_ = auVar120._24_4_ * 0.0;
      auVar30._28_4_ = auVar120._28_4_;
      auVar120 = vsubps_avx(auVar9,local_b40);
      auVar31._4_4_ = auVar261._4_4_ * auVar120._4_4_;
      auVar31._0_4_ = auVar261._0_4_ * auVar120._0_4_;
      auVar31._8_4_ = auVar261._8_4_ * auVar120._8_4_;
      auVar31._12_4_ = auVar261._12_4_ * auVar120._12_4_;
      auVar31._16_4_ = auVar120._16_4_ * 0.0;
      auVar31._20_4_ = auVar120._20_4_ * 0.0;
      auVar31._24_4_ = auVar120._24_4_ * 0.0;
      auVar31._28_4_ = auVar120._28_4_;
      auVar261 = vfmadd213ps_fma(auVar276,auVar30,auVar266);
      local_500 = ZEXT1632(CONCAT412(auVar261._12_4_ * fVar257,
                                     CONCAT48(auVar261._8_4_ * fVar256,
                                              CONCAT44(auVar261._4_4_ * fVar291,
                                                       auVar261._0_4_ * fVar218))));
      auVar261 = vfmadd213ps_fma(auVar276,auVar31,auVar266);
      local_520 = ZEXT1632(CONCAT412(auVar261._12_4_ * fVar257,
                                     CONCAT48(auVar261._8_4_ * fVar256,
                                              CONCAT44(auVar261._4_4_ * fVar291,
                                                       auVar261._0_4_ * fVar218))));
      auVar150._8_4_ = 0x7f800000;
      auVar150._0_8_ = 0x7f8000007f800000;
      auVar150._12_4_ = 0x7f800000;
      auVar150._16_4_ = 0x7f800000;
      auVar150._20_4_ = 0x7f800000;
      auVar150._24_4_ = 0x7f800000;
      auVar150._28_4_ = 0x7f800000;
      local_c00 = vblendvps_avx(auVar150,auVar30,auVar239);
      auVar64._4_4_ = uStack_89c;
      auVar64._0_4_ = local_8a0;
      auVar64._8_4_ = uStack_898;
      auVar64._12_4_ = uStack_894;
      auVar64._16_4_ = uStack_890;
      auVar64._20_4_ = uStack_88c;
      auVar64._24_4_ = uStack_888;
      auVar64._28_4_ = uStack_884;
      auVar120 = vandps_avx(local_a00,auVar64);
      auVar120 = vmaxps_avx(local_4a0,auVar120);
      auVar10._4_4_ = auVar120._4_4_ * 1.9073486e-06;
      auVar10._0_4_ = auVar120._0_4_ * 1.9073486e-06;
      auVar10._8_4_ = auVar120._8_4_ * 1.9073486e-06;
      auVar10._12_4_ = auVar120._12_4_ * 1.9073486e-06;
      auVar10._16_4_ = auVar120._16_4_ * 1.9073486e-06;
      auVar10._20_4_ = auVar120._20_4_ * 1.9073486e-06;
      auVar10._24_4_ = auVar120._24_4_ * 1.9073486e-06;
      auVar10._28_4_ = auVar120._28_4_;
      auVar120 = vandps_avx(local_4c0,auVar64);
      auVar120 = vcmpps_avx(auVar120,auVar10,1);
      auVar151._8_4_ = 0xff800000;
      auVar151._0_8_ = 0xff800000ff800000;
      auVar151._12_4_ = 0xff800000;
      auVar151._16_4_ = 0xff800000;
      auVar151._20_4_ = 0xff800000;
      auVar151._24_4_ = 0xff800000;
      auVar151._28_4_ = 0xff800000;
      auVar200 = vblendvps_avx(auVar151,auVar31,auVar239);
      auVar9 = auVar239 & auVar120;
      if ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar9 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar9 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar9 >> 0x7f,0) != '\0') ||
            (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar9 >> 0xbf,0) != '\0') ||
          (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar9[0x1f] < '\0')
      {
        auVar117 = vandps_avx(auVar120,auVar239);
        auVar120 = vcmpps_avx(auVar6,_DAT_02020f00,2);
        auVar242 = ZEXT3264(auVar120);
        auVar126._8_4_ = 0xff800000;
        auVar126._0_8_ = 0xff800000ff800000;
        auVar126._12_4_ = 0xff800000;
        auVar126._16_4_ = 0xff800000;
        auVar126._20_4_ = 0xff800000;
        auVar126._24_4_ = 0xff800000;
        auVar126._28_4_ = 0xff800000;
        auVar164._8_4_ = 0x7f800000;
        auVar164._0_8_ = 0x7f8000007f800000;
        auVar164._12_4_ = 0x7f800000;
        auVar164._16_4_ = 0x7f800000;
        auVar164._20_4_ = 0x7f800000;
        auVar164._24_4_ = 0x7f800000;
        auVar164._28_4_ = 0x7f800000;
        auVar6 = vblendvps_avx(auVar164,auVar126,auVar120);
        auVar261 = vpackssdw_avx(auVar117._0_16_,auVar117._16_16_);
        auVar10 = vpmovsxwd_avx2(auVar261);
        local_c00 = vblendvps_avx(local_c00,auVar6,auVar10);
        auVar6 = vblendvps_avx(auVar126,auVar164,auVar120);
        auVar200 = vblendvps_avx(auVar200,auVar6,auVar10);
        auVar215._0_8_ = auVar117._0_8_ ^ 0xffffffffffffffff;
        auVar215._8_4_ = auVar117._8_4_ ^ 0xffffffff;
        auVar215._12_4_ = auVar117._12_4_ ^ 0xffffffff;
        auVar215._16_4_ = auVar117._16_4_ ^ 0xffffffff;
        auVar215._20_4_ = auVar117._20_4_ ^ 0xffffffff;
        auVar215._24_4_ = auVar117._24_4_ ^ 0xffffffff;
        auVar215._28_4_ = auVar117._28_4_ ^ 0xffffffff;
        auVar117 = vorps_avx(auVar120,auVar215);
        auVar117 = vandps_avx(auVar239,auVar117);
      }
      auVar289 = ZEXT3264(auVar10);
    }
    auVar216 = ZEXT3264(local_240);
    auVar6 = local_240 & auVar117;
    if ((((((((auVar6 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar6 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar6 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar6 >> 0x7f,0) != '\0') ||
          (auVar6 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar6 >> 0xbf,0) != '\0') ||
        (auVar6 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar6[0x1f] < '\0') {
      local_280 = ZEXT1632(auVar192);
      fVar165 = *(float *)(ray + k * 4 + 0x80) - (float)local_910._0_4_;
      auVar238._4_4_ = fVar165;
      auVar238._0_4_ = fVar165;
      auVar238._8_4_ = fVar165;
      auVar238._12_4_ = fVar165;
      auVar238._16_4_ = fVar165;
      auVar238._20_4_ = fVar165;
      auVar238._24_4_ = fVar165;
      auVar238._28_4_ = fVar165;
      auVar120 = vminps_avx(auVar238,auVar200);
      auVar32._4_4_ = fVar258 * local_740._4_4_;
      auVar32._0_4_ = fVar183 * local_740._0_4_;
      auVar32._8_4_ = fVar268 * local_740._8_4_;
      auVar32._12_4_ = fVar269 * local_740._12_4_;
      auVar32._16_4_ = fVar270 * local_740._16_4_;
      auVar32._20_4_ = fVar271 * local_740._20_4_;
      auVar32._24_4_ = fVar272 * local_740._24_4_;
      auVar32._28_4_ = fVar165;
      auVar192 = vfmadd213ps_fma(auVar8,local_a60,auVar32);
      auVar261 = vfmadd213ps_fma(auVar252,local_940,ZEXT1632(auVar192));
      auVar33._4_4_ = local_740._4_4_ * (float)local_880._4_4_;
      auVar33._0_4_ = local_740._0_4_ * (float)local_880._0_4_;
      auVar33._8_4_ = local_740._8_4_ * fStack_878;
      auVar33._12_4_ = local_740._12_4_ * fStack_874;
      auVar33._16_4_ = local_740._16_4_ * fStack_870;
      auVar33._20_4_ = local_740._20_4_ * fStack_86c;
      auVar33._24_4_ = local_740._24_4_ * fStack_868;
      auVar33._28_4_ = fVar165;
      auVar192 = vfmadd231ps_fma(auVar33,_local_820,local_a60);
      auVar112 = vfmadd231ps_fma(ZEXT1632(auVar192),_local_800,local_940);
      auVar65._4_4_ = uStack_89c;
      auVar65._0_4_ = local_8a0;
      auVar65._8_4_ = uStack_898;
      auVar65._12_4_ = uStack_894;
      auVar65._16_4_ = uStack_890;
      auVar65._20_4_ = uStack_88c;
      auVar65._24_4_ = uStack_888;
      auVar65._28_4_ = uStack_884;
      auVar6 = vandps_avx(ZEXT1632(auVar112),auVar65);
      auVar152._8_4_ = 0x219392ef;
      auVar152._0_8_ = 0x219392ef219392ef;
      auVar152._12_4_ = 0x219392ef;
      auVar152._16_4_ = 0x219392ef;
      auVar152._20_4_ = 0x219392ef;
      auVar152._24_4_ = 0x219392ef;
      auVar152._28_4_ = 0x219392ef;
      auVar8 = vcmpps_avx(auVar6,auVar152,1);
      auVar6 = vrcpps_avx(ZEXT1632(auVar112));
      auVar299._8_4_ = 0x3f800000;
      auVar299._0_8_ = &DAT_3f8000003f800000;
      auVar299._12_4_ = 0x3f800000;
      auVar299._16_4_ = 0x3f800000;
      auVar299._20_4_ = 0x3f800000;
      auVar299._24_4_ = 0x3f800000;
      auVar299._28_4_ = 0x3f800000;
      auVar239 = ZEXT1632(auVar112);
      auVar192 = vfnmadd213ps_fma(auVar6,auVar239,auVar299);
      auVar192 = vfmadd132ps_fma(ZEXT1632(auVar192),auVar6,auVar6);
      auVar282._0_4_ = auVar112._0_4_ ^ local_620;
      auVar282._4_4_ = auVar112._4_4_ ^ uStack_61c;
      auVar282._8_4_ = auVar112._8_4_ ^ uStack_618;
      auVar282._12_4_ = auVar112._12_4_ ^ uStack_614;
      auVar282._16_4_ = fStack_610;
      auVar282._20_4_ = fStack_60c;
      auVar282._24_4_ = fStack_608;
      auVar282._28_4_ = uStack_604;
      auVar285._0_4_ = auVar192._0_4_ * (float)(auVar261._0_4_ ^ local_620);
      auVar285._4_4_ = auVar192._4_4_ * (float)(auVar261._4_4_ ^ uStack_61c);
      auVar285._8_4_ = auVar192._8_4_ * (float)(auVar261._8_4_ ^ uStack_618);
      auVar285._12_4_ = auVar192._12_4_ * (float)(auVar261._12_4_ ^ uStack_614);
      auVar285._16_4_ = fStack_610 * 0.0;
      auVar285._20_4_ = fStack_60c * 0.0;
      auVar285._24_4_ = fStack_608 * 0.0;
      auVar285._28_4_ = 0;
      auVar6 = vcmpps_avx(auVar239,auVar282,1);
      auVar6 = vorps_avx(auVar8,auVar6);
      auVar294._8_4_ = 0xff800000;
      auVar294._0_8_ = 0xff800000ff800000;
      auVar294._12_4_ = 0xff800000;
      auVar294._16_4_ = 0xff800000;
      auVar294._20_4_ = 0xff800000;
      auVar294._24_4_ = 0xff800000;
      auVar294._28_4_ = 0xff800000;
      auVar6 = vblendvps_avx(auVar285,auVar294,auVar6);
      auVar85._4_4_ = fStack_25c;
      auVar85._0_4_ = local_260;
      auVar85._8_4_ = fStack_258;
      auVar85._12_4_ = fStack_254;
      auVar85._16_4_ = fStack_250;
      auVar85._20_4_ = fStack_24c;
      auVar85._24_4_ = fStack_248;
      auVar85._28_4_ = fStack_244;
      auVar252 = vmaxps_avx(auVar85,local_c00);
      auVar252 = vmaxps_avx(auVar252,auVar6);
      auVar6 = vcmpps_avx(auVar239,auVar282,6);
      auVar6 = vorps_avx(auVar8,auVar6);
      auVar249._8_4_ = 0x7f800000;
      auVar249._0_8_ = 0x7f8000007f800000;
      auVar249._12_4_ = 0x7f800000;
      auVar249._16_4_ = 0x7f800000;
      auVar249._20_4_ = 0x7f800000;
      auVar249._24_4_ = 0x7f800000;
      auVar249._28_4_ = 0x7f800000;
      auVar6 = vblendvps_avx(auVar285,auVar249,auVar6);
      auVar120 = vminps_avx(auVar120,auVar6);
      auVar6 = vsubps_avx(ZEXT832(0) << 0x20,auVar240);
      auVar8 = vsubps_avx(ZEXT832(0) << 0x20,_local_a40);
      auVar34._4_4_ = auVar8._4_4_ * fVar290;
      auVar34._0_4_ = auVar8._0_4_ * fVar217;
      auVar34._8_4_ = auVar8._8_4_ * fVar243;
      auVar34._12_4_ = auVar8._12_4_ * fVar244;
      auVar34._16_4_ = auVar8._16_4_ * fVar127;
      auVar34._20_4_ = auVar8._20_4_ * fVar129;
      auVar34._24_4_ = auVar8._24_4_ * fVar131;
      auVar34._28_4_ = auVar8._28_4_;
      auVar192 = vfnmsub231ps_fma(auVar34,local_aa0,auVar6);
      auVar6 = vsubps_avx(ZEXT832(0) << 0x20,auVar154);
      auVar261 = vfnmadd231ps_fma(ZEXT1632(auVar192),local_a80,auVar6);
      auVar35._4_4_ = fVar290 * (float)local_880._4_4_;
      auVar35._0_4_ = fVar217 * (float)local_880._0_4_;
      auVar35._8_4_ = fVar243 * fStack_878;
      auVar35._12_4_ = fVar244 * fStack_874;
      auVar35._16_4_ = fVar127 * fStack_870;
      auVar35._20_4_ = fVar129 * fStack_86c;
      auVar35._24_4_ = fVar131 * fStack_868;
      auVar35._28_4_ = auVar6._28_4_;
      auVar192 = vfnmsub231ps_fma(auVar35,_local_820,local_aa0);
      auVar112 = vfnmadd231ps_fma(ZEXT1632(auVar192),_local_800,local_a80);
      auVar242 = ZEXT1664(auVar112);
      auVar6 = vandps_avx(ZEXT1632(auVar112),auVar65);
      auVar154 = vrcpps_avx(ZEXT1632(auVar112));
      auVar174._8_4_ = 0x219392ef;
      auVar174._0_8_ = 0x219392ef219392ef;
      auVar174._12_4_ = 0x219392ef;
      auVar174._16_4_ = 0x219392ef;
      auVar174._20_4_ = 0x219392ef;
      auVar174._24_4_ = 0x219392ef;
      auVar174._28_4_ = 0x219392ef;
      auVar8 = vcmpps_avx(auVar6,auVar174,1);
      auVar283 = ZEXT3264(auVar8);
      auVar240 = ZEXT1632(auVar112);
      auVar192 = vfnmadd213ps_fma(auVar154,auVar240,auVar299);
      auVar192 = vfmadd132ps_fma(ZEXT1632(auVar192),auVar154,auVar154);
      auVar286._0_4_ = auVar112._0_4_ ^ local_620;
      auVar286._4_4_ = auVar112._4_4_ ^ uStack_61c;
      auVar286._8_4_ = auVar112._8_4_ ^ uStack_618;
      auVar286._12_4_ = auVar112._12_4_ ^ uStack_614;
      auVar286._16_4_ = fStack_610;
      auVar286._20_4_ = fStack_60c;
      auVar286._24_4_ = fStack_608;
      auVar286._28_4_ = uStack_604;
      auVar289 = ZEXT3264(auVar286);
      auVar36._4_4_ = auVar192._4_4_ * (float)(auVar261._4_4_ ^ uStack_61c);
      auVar36._0_4_ = auVar192._0_4_ * (float)(auVar261._0_4_ ^ local_620);
      auVar36._8_4_ = auVar192._8_4_ * (float)(auVar261._8_4_ ^ uStack_618);
      auVar36._12_4_ = auVar192._12_4_ * (float)(auVar261._12_4_ ^ uStack_614);
      auVar36._16_4_ = fStack_610 * 0.0;
      auVar36._20_4_ = fStack_60c * 0.0;
      auVar36._24_4_ = fStack_608 * 0.0;
      auVar36._28_4_ = uStack_604;
      auVar6 = vcmpps_avx(auVar240,auVar286,1);
      auVar6 = vorps_avx(auVar8,auVar6);
      auVar153._8_4_ = 0xff800000;
      auVar153._0_8_ = 0xff800000ff800000;
      auVar153._12_4_ = 0xff800000;
      auVar153._16_4_ = 0xff800000;
      auVar153._20_4_ = 0xff800000;
      auVar153._24_4_ = 0xff800000;
      auVar153._28_4_ = 0xff800000;
      auVar6 = vblendvps_avx(auVar36,auVar153,auVar6);
      _local_860 = vmaxps_avx(auVar252,auVar6);
      auVar6 = vcmpps_avx(auVar240,auVar286,6);
      auVar6 = vorps_avx(auVar8,auVar6);
      auVar201._8_4_ = 0x7f800000;
      auVar201._0_8_ = 0x7f8000007f800000;
      auVar201._12_4_ = 0x7f800000;
      auVar201._16_4_ = 0x7f800000;
      auVar201._20_4_ = 0x7f800000;
      auVar201._24_4_ = 0x7f800000;
      auVar201._28_4_ = 0x7f800000;
      auVar6 = vblendvps_avx(auVar36,auVar201,auVar6);
      auVar117 = vandps_avx(auVar117,local_240);
      auVar216 = ZEXT3264(auVar117);
      local_2a0 = vminps_avx(auVar120,auVar6);
      auVar6 = vcmpps_avx(_local_860,local_2a0,2);
      auVar8 = auVar117 & auVar6;
      if ((((((((auVar8 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar8 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar8 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar8 >> 0x7f,0) != '\0') ||
            (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar8 >> 0xbf,0) != '\0') ||
          (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar8[0x1f] < '\0')
      {
        auVar289 = ZEXT3264(auVar299);
        auVar8 = vminps_avx(local_500,auVar299);
        auVar51 = ZEXT812(0);
        auVar180 = ZEXT1264(auVar51) << 0x20;
        auVar8 = vmaxps_avx(auVar8,ZEXT1232(auVar51) << 0x20);
        auVar252 = vminps_avx(local_520,auVar299);
        auVar252 = vmaxps_avx(auVar252,ZEXT1232(auVar51) << 0x20);
        auVar37._4_4_ = (auVar8._4_4_ + 1.0) * 0.125;
        auVar37._0_4_ = (auVar8._0_4_ + 0.0) * 0.125;
        auVar37._8_4_ = (auVar8._8_4_ + 2.0) * 0.125;
        auVar37._12_4_ = (auVar8._12_4_ + 3.0) * 0.125;
        auVar37._16_4_ = (auVar8._16_4_ + 4.0) * 0.125;
        auVar37._20_4_ = (auVar8._20_4_ + 5.0) * 0.125;
        auVar37._24_4_ = (auVar8._24_4_ + 6.0) * 0.125;
        auVar37._28_4_ = auVar8._28_4_ + 7.0;
        auVar192 = vfmadd213ps_fma(auVar37,local_960,local_9e0);
        auVar38._4_4_ = (auVar252._4_4_ + 1.0) * 0.125;
        auVar38._0_4_ = (auVar252._0_4_ + 0.0) * 0.125;
        auVar38._8_4_ = (auVar252._8_4_ + 2.0) * 0.125;
        auVar38._12_4_ = (auVar252._12_4_ + 3.0) * 0.125;
        auVar38._16_4_ = (auVar252._16_4_ + 4.0) * 0.125;
        auVar38._20_4_ = (auVar252._20_4_ + 5.0) * 0.125;
        auVar38._24_4_ = (auVar252._24_4_ + 6.0) * 0.125;
        auVar38._28_4_ = auVar252._28_4_ + 7.0;
        auVar261 = vfmadd213ps_fma(auVar38,local_960,local_9e0);
        auVar8 = vminps_avx(local_760,local_780);
        auVar252 = vminps_avx(local_7a0,auVar11);
        auVar8 = vminps_avx(auVar8,auVar252);
        auVar124 = vsubps_avx(auVar8,auVar124);
        auVar117 = vandps_avx(auVar6,auVar117);
        auVar216 = ZEXT3264(auVar117);
        local_500 = ZEXT1632(auVar192);
        local_520 = ZEXT1632(auVar261);
        auVar39._4_4_ = auVar124._4_4_ * 0.99999976;
        auVar39._0_4_ = auVar124._0_4_ * 0.99999976;
        auVar39._8_4_ = auVar124._8_4_ * 0.99999976;
        auVar39._12_4_ = auVar124._12_4_ * 0.99999976;
        auVar39._16_4_ = auVar124._16_4_ * 0.99999976;
        auVar39._20_4_ = auVar124._20_4_ * 0.99999976;
        auVar39._24_4_ = auVar124._24_4_ * 0.99999976;
        auVar39._28_4_ = auVar124._28_4_;
        auVar124 = vmaxps_avx(ZEXT832(0) << 0x20,auVar39);
        auVar40._4_4_ = auVar124._4_4_ * auVar124._4_4_;
        auVar40._0_4_ = auVar124._0_4_ * auVar124._0_4_;
        auVar40._8_4_ = auVar124._8_4_ * auVar124._8_4_;
        auVar40._12_4_ = auVar124._12_4_ * auVar124._12_4_;
        auVar40._16_4_ = auVar124._16_4_ * auVar124._16_4_;
        auVar40._20_4_ = auVar124._20_4_ * auVar124._20_4_;
        auVar40._24_4_ = auVar124._24_4_ * auVar124._24_4_;
        auVar40._28_4_ = auVar124._28_4_;
        auVar6 = vsubps_avx(local_640,auVar40);
        auVar41._4_4_ = auVar6._4_4_ * fVar219 * 4.0;
        auVar41._0_4_ = auVar6._0_4_ * fVar220 * 4.0;
        auVar41._8_4_ = auVar6._8_4_ * fVar221 * 4.0;
        auVar41._12_4_ = auVar6._12_4_ * fVar102 * 4.0;
        auVar41._16_4_ = auVar6._16_4_ * fVar128 * 4.0;
        auVar41._20_4_ = auVar6._20_4_ * fVar130 * 4.0;
        auVar41._24_4_ = auVar6._24_4_ * fVar132 * 4.0;
        auVar41._28_4_ = auVar124._28_4_;
        auVar8 = vsubps_avx(auVar28,auVar41);
        auVar283 = ZEXT3264(auVar8);
        auVar124 = vcmpps_avx(auVar8,ZEXT1232(auVar51) << 0x20,5);
        if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar124 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar124 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar124 >> 0x7f,0) == '\0') &&
              (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar124 >> 0xbf,0) == '\0') &&
            (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar124[0x1f]) {
          auVar120 = SUB6432(ZEXT864(0),0) << 0x20;
          local_8e0 = ZEXT832(0) << 0x20;
          _local_660 = ZEXT832(0) << 0x20;
          auVar154 = ZEXT1632(ZEXT816(0) << 0x40);
          auVar241._8_4_ = 0x7f800000;
          auVar241._0_8_ = 0x7f8000007f800000;
          auVar241._12_4_ = 0x7f800000;
          auVar241._16_4_ = 0x7f800000;
          auVar241._20_4_ = 0x7f800000;
          auVar241._24_4_ = 0x7f800000;
          auVar241._28_4_ = 0x7f800000;
          auVar250._8_4_ = 0xff800000;
          auVar250._0_8_ = 0xff800000ff800000;
          auVar250._12_4_ = 0xff800000;
          auVar250._16_4_ = 0xff800000;
          auVar250._20_4_ = 0xff800000;
          auVar250._24_4_ = 0xff800000;
          auVar250._28_4_ = 0xff800000;
          local_8c0 = local_8e0;
        }
        else {
          auVar120 = vsqrtps_avx(auVar8);
          auVar251._0_4_ = fVar220 + fVar220;
          auVar251._4_4_ = fVar219 + fVar219;
          auVar251._8_4_ = fVar221 + fVar221;
          auVar251._12_4_ = fVar102 + fVar102;
          auVar251._16_4_ = fVar128 + fVar128;
          auVar251._20_4_ = fVar130 + fVar130;
          auVar251._24_4_ = fVar132 + fVar132;
          auVar251._28_4_ = fVar204 + fVar204;
          auVar252 = vrcpps_avx(auVar251);
          auVar192 = vfnmadd213ps_fma(auVar251,auVar252,auVar299);
          auVar192 = vfmadd132ps_fma(ZEXT1632(auVar192),auVar252,auVar252);
          auVar287._0_4_ = (uint)local_b40._0_4_ ^ local_620;
          auVar287._4_4_ = (uint)local_b40._4_4_ ^ uStack_61c;
          auVar287._8_4_ = (uint)local_b40._8_4_ ^ uStack_618;
          auVar287._12_4_ = (uint)local_b40._12_4_ ^ uStack_614;
          auVar287._16_4_ = (uint)local_b40._16_4_ ^ (uint)fStack_610;
          auVar287._20_4_ = (uint)local_b40._20_4_ ^ (uint)fStack_60c;
          auVar287._24_4_ = (uint)local_b40._24_4_ ^ (uint)fStack_608;
          auVar287._28_4_ = (uint)local_b40._28_4_ ^ uStack_604;
          auVar252 = vsubps_avx(auVar287,auVar120);
          auVar154 = vsubps_avx(auVar120,local_b40);
          fVar217 = auVar252._0_4_ * auVar192._0_4_;
          fVar220 = auVar252._4_4_ * auVar192._4_4_;
          auVar42._4_4_ = fVar220;
          auVar42._0_4_ = fVar217;
          fVar290 = auVar252._8_4_ * auVar192._8_4_;
          auVar42._8_4_ = fVar290;
          fVar219 = auVar252._12_4_ * auVar192._12_4_;
          auVar42._12_4_ = fVar219;
          fVar243 = auVar252._16_4_ * 0.0;
          auVar42._16_4_ = fVar243;
          fVar221 = auVar252._20_4_ * 0.0;
          auVar42._20_4_ = fVar221;
          fVar244 = auVar252._24_4_ * 0.0;
          auVar42._24_4_ = fVar244;
          auVar42._28_4_ = auVar120._28_4_;
          fVar102 = auVar154._0_4_ * auVar192._0_4_;
          fVar127 = auVar154._4_4_ * auVar192._4_4_;
          auVar43._4_4_ = fVar127;
          auVar43._0_4_ = fVar102;
          fVar128 = auVar154._8_4_ * auVar192._8_4_;
          auVar43._8_4_ = fVar128;
          fVar129 = auVar154._12_4_ * auVar192._12_4_;
          auVar43._12_4_ = fVar129;
          fVar130 = auVar154._16_4_ * 0.0;
          auVar43._16_4_ = fVar130;
          fVar131 = auVar154._20_4_ * 0.0;
          auVar43._20_4_ = fVar131;
          fVar132 = auVar154._24_4_ * 0.0;
          auVar43._24_4_ = fVar132;
          auVar43._28_4_ = auVar252._28_4_;
          auVar289 = ZEXT3264(auVar43);
          auVar192 = vfmadd213ps_fma(auVar276,auVar42,auVar266);
          auVar261 = vfmadd213ps_fma(auVar276,auVar43,auVar266);
          auVar252 = ZEXT1632(CONCAT412(fVar257 * auVar192._12_4_,
                                        CONCAT48(fVar256 * auVar192._8_4_,
                                                 CONCAT44(fVar291 * auVar192._4_4_,
                                                          fVar218 * auVar192._0_4_))));
          auVar120 = ZEXT1632(CONCAT412(fVar257 * auVar261._12_4_,
                                        CONCAT48(fVar256 * auVar261._8_4_,
                                                 CONCAT44(fVar291 * auVar261._4_4_,
                                                          fVar218 * auVar261._0_4_))));
          auVar192 = vfmadd213ps_fma(local_580,auVar252,local_560);
          auVar261 = vfmadd213ps_fma(local_580,auVar120,local_560);
          auVar112 = vfmadd213ps_fma(local_5a0,auVar252,local_540);
          auVar7 = vfmadd213ps_fma(local_5a0,auVar120,local_540);
          auVar298 = vfmadd213ps_fma(auVar252,local_5c0,_local_660);
          auVar292 = vfmadd213ps_fma(local_5c0,auVar120,_local_660);
          auVar44._4_4_ = (float)local_800._4_4_ * fVar220;
          auVar44._0_4_ = (float)local_800._0_4_ * fVar217;
          auVar44._8_4_ = fStack_7f8 * fVar290;
          auVar44._12_4_ = fStack_7f4 * fVar219;
          auVar44._16_4_ = fStack_7f0 * fVar243;
          auVar44._20_4_ = fStack_7ec * fVar221;
          auVar44._24_4_ = fStack_7e8 * fVar244;
          auVar44._28_4_ = 0;
          auVar120 = vsubps_avx(auVar44,ZEXT1632(auVar192));
          auVar45._4_4_ = (float)local_820._4_4_ * fVar220;
          auVar45._0_4_ = (float)local_820._0_4_ * fVar217;
          auVar45._8_4_ = fStack_818 * fVar290;
          auVar45._12_4_ = fStack_814 * fVar219;
          auVar45._16_4_ = fStack_810 * fVar243;
          auVar45._20_4_ = fStack_80c * fVar221;
          auVar45._24_4_ = fStack_808 * fVar244;
          auVar45._28_4_ = fVar204;
          auVar154 = vsubps_avx(auVar45,ZEXT1632(auVar112));
          auVar175._0_4_ = (float)local_880._0_4_ * fVar217;
          auVar175._4_4_ = (float)local_880._4_4_ * fVar220;
          auVar175._8_4_ = fStack_878 * fVar290;
          auVar175._12_4_ = fStack_874 * fVar219;
          auVar175._16_4_ = fStack_870 * fVar243;
          auVar175._20_4_ = fStack_86c * fVar221;
          auVar175._24_4_ = fStack_868 * fVar244;
          auVar175._28_4_ = 0;
          auVar252 = vsubps_avx(auVar175,ZEXT1632(auVar298));
          auVar180 = ZEXT3264(auVar252);
          auVar253._0_4_ = (float)local_800._0_4_ * fVar102;
          auVar253._4_4_ = (float)local_800._4_4_ * fVar127;
          auVar253._8_4_ = fStack_7f8 * fVar128;
          auVar253._12_4_ = fStack_7f4 * fVar129;
          auVar253._16_4_ = fStack_7f0 * fVar130;
          auVar253._20_4_ = fStack_7ec * fVar131;
          auVar253._24_4_ = fStack_7e8 * fVar132;
          auVar253._28_4_ = 0;
          local_8c0 = vsubps_avx(auVar253,ZEXT1632(auVar261));
          auVar46._4_4_ = (float)local_820._4_4_ * fVar127;
          auVar46._0_4_ = (float)local_820._0_4_ * fVar102;
          auVar46._8_4_ = fStack_818 * fVar128;
          auVar46._12_4_ = fStack_814 * fVar129;
          auVar46._16_4_ = fStack_810 * fVar130;
          auVar46._20_4_ = fStack_80c * fVar131;
          auVar46._24_4_ = fStack_808 * fVar132;
          auVar46._28_4_ = local_8c0._28_4_;
          local_8e0 = vsubps_avx(auVar46,ZEXT1632(auVar7));
          auVar47._4_4_ = (float)local_880._4_4_ * fVar127;
          auVar47._0_4_ = (float)local_880._0_4_ * fVar102;
          auVar47._8_4_ = fStack_878 * fVar128;
          auVar47._12_4_ = fStack_874 * fVar129;
          auVar47._16_4_ = fStack_870 * fVar130;
          auVar47._20_4_ = fStack_86c * fVar131;
          auVar47._24_4_ = fStack_868 * fVar132;
          auVar47._28_4_ = local_8e0._28_4_;
          _local_660 = vsubps_avx(auVar47,ZEXT1632(auVar292));
          auVar252 = vcmpps_avx(auVar8,_DAT_02020f00,5);
          auVar254._8_4_ = 0x7f800000;
          auVar254._0_8_ = 0x7f8000007f800000;
          auVar254._12_4_ = 0x7f800000;
          auVar254._16_4_ = 0x7f800000;
          auVar254._20_4_ = 0x7f800000;
          auVar254._24_4_ = 0x7f800000;
          auVar254._28_4_ = 0x7f800000;
          auVar241 = vblendvps_avx(auVar254,auVar42,auVar252);
          auVar66._4_4_ = uStack_89c;
          auVar66._0_4_ = local_8a0;
          auVar66._8_4_ = uStack_898;
          auVar66._12_4_ = uStack_894;
          auVar66._16_4_ = uStack_890;
          auVar66._20_4_ = uStack_88c;
          auVar66._24_4_ = uStack_888;
          auVar66._28_4_ = uStack_884;
          auVar8 = vandps_avx(auVar66,local_a00);
          auVar8 = vmaxps_avx(local_4a0,auVar8);
          auVar283 = ZEXT3264(CONCAT428(0x36000000,
                                        CONCAT424(0x36000000,
                                                  CONCAT420(0x36000000,
                                                            CONCAT416(0x36000000,
                                                                      CONCAT412(0x36000000,
                                                                                CONCAT48(0x36000000,
                                                                                                                                                                                  
                                                  0x3600000036000000)))))));
          auVar48._4_4_ = auVar8._4_4_ * 1.9073486e-06;
          auVar48._0_4_ = auVar8._0_4_ * 1.9073486e-06;
          auVar48._8_4_ = auVar8._8_4_ * 1.9073486e-06;
          auVar48._12_4_ = auVar8._12_4_ * 1.9073486e-06;
          auVar48._16_4_ = auVar8._16_4_ * 1.9073486e-06;
          auVar48._20_4_ = auVar8._20_4_ * 1.9073486e-06;
          auVar48._24_4_ = auVar8._24_4_ * 1.9073486e-06;
          auVar48._28_4_ = auVar8._28_4_;
          auVar8 = vandps_avx(auVar66,local_4c0);
          auVar8 = vcmpps_avx(auVar8,auVar48,1);
          auVar277 = ZEXT3264(auVar8);
          auVar255._8_4_ = 0xff800000;
          auVar255._0_8_ = 0xff800000ff800000;
          auVar255._12_4_ = 0xff800000;
          auVar255._16_4_ = 0xff800000;
          auVar255._20_4_ = 0xff800000;
          auVar255._24_4_ = 0xff800000;
          auVar255._28_4_ = 0xff800000;
          auVar250 = vblendvps_avx(auVar255,auVar43,auVar252);
          auVar240 = auVar252 & auVar8;
          if ((((((((auVar240 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar240 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar240 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar240 >> 0x7f,0) != '\0') ||
                (auVar240 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar240 >> 0xbf,0) != '\0') ||
              (auVar240 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar240[0x1f] < '\0') {
            auVar124 = vandps_avx(auVar8,auVar252);
            auVar8 = vcmpps_avx(auVar6,ZEXT832(0) << 0x20,2);
            auVar288._8_4_ = 0xff800000;
            auVar288._0_8_ = 0xff800000ff800000;
            auVar288._12_4_ = 0xff800000;
            auVar288._16_4_ = 0xff800000;
            auVar288._20_4_ = 0xff800000;
            auVar288._24_4_ = 0xff800000;
            auVar288._28_4_ = 0xff800000;
            auVar289 = ZEXT3264(auVar288);
            auVar295._8_4_ = 0x7f800000;
            auVar295._0_8_ = 0x7f8000007f800000;
            auVar295._12_4_ = 0x7f800000;
            auVar295._16_4_ = 0x7f800000;
            auVar295._20_4_ = 0x7f800000;
            auVar295._24_4_ = 0x7f800000;
            auVar295._28_4_ = 0x7f800000;
            auVar6 = vblendvps_avx(auVar295,auVar288,auVar8);
            auVar192 = vpackssdw_avx(auVar124._0_16_,auVar124._16_16_);
            auVar240 = vpmovsxwd_avx2(auVar192);
            auVar277 = ZEXT3264(auVar240);
            auVar241 = vblendvps_avx(auVar241,auVar6,auVar240);
            auVar6 = vblendvps_avx(auVar288,auVar295,auVar8);
            auVar283 = ZEXT3264(auVar6);
            auVar250 = vblendvps_avx(auVar250,auVar6,auVar240);
            auVar231._0_8_ = auVar124._0_8_ ^ 0xffffffffffffffff;
            auVar231._8_4_ = auVar124._8_4_ ^ 0xffffffff;
            auVar231._12_4_ = auVar124._12_4_ ^ 0xffffffff;
            auVar231._16_4_ = auVar124._16_4_ ^ 0xffffffff;
            auVar231._20_4_ = auVar124._20_4_ ^ 0xffffffff;
            auVar231._24_4_ = auVar124._24_4_ ^ 0xffffffff;
            auVar231._28_4_ = auVar124._28_4_ ^ 0xffffffff;
            auVar124 = vorps_avx(auVar8,auVar231);
            auVar124 = vandps_avx(auVar252,auVar124);
          }
        }
        auVar267 = ZEXT3264(_local_860);
        local_300 = _local_860;
        local_2e0 = vminps_avx(local_2a0,auVar241);
        _local_2c0 = vmaxps_avx(_local_860,auVar250);
        auVar6 = vcmpps_avx(_local_860,local_2e0,2);
        local_540 = vandps_avx(auVar6,auVar117);
        local_5e0 = local_540;
        auVar6 = vcmpps_avx(_local_2c0,local_2a0,2);
        local_600 = vandps_avx(auVar6,auVar117);
        auVar242 = ZEXT3264(local_600);
        auVar117 = vorps_avx(local_600,local_540);
        if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar117 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar117 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar117 >> 0x7f,0) != '\0') ||
              (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar117 >> 0xbf,0) != '\0') ||
            (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar117[0x1f] < '\0') {
          local_580 = local_600;
          local_5a0._0_8_ = auVar124._0_8_ ^ 0xffffffffffffffff;
          local_5a0._8_4_ = auVar124._8_4_ ^ 0xffffffff;
          local_5a0._12_4_ = auVar124._12_4_ ^ 0xffffffff;
          local_5a0._16_4_ = auVar124._16_4_ ^ 0xffffffff;
          local_5a0._20_4_ = auVar124._20_4_ ^ 0xffffffff;
          local_5a0._24_4_ = auVar124._24_4_ ^ 0xffffffff;
          local_5a0._28_4_ = auVar124._28_4_ ^ 0xffffffff;
          auVar216._0_4_ = auVar180._0_4_ * (float)local_880._0_4_;
          auVar216._4_4_ = auVar180._4_4_ * (float)local_880._4_4_;
          auVar216._8_4_ = auVar180._8_4_ * fStack_878;
          auVar216._12_4_ = auVar180._12_4_ * fStack_874;
          auVar216._16_4_ = auVar180._16_4_ * fStack_870;
          auVar216._20_4_ = auVar180._20_4_ * fStack_86c;
          auVar216._28_36_ = auVar180._28_36_;
          auVar216._24_4_ = auVar180._24_4_ * fStack_868;
          auVar192 = vfmadd132ps_fma(auVar154,auVar216._0_32_,_local_820);
          auVar192 = vfmadd132ps_fma(auVar120,ZEXT1632(auVar192),_local_800);
          auVar67._4_4_ = uStack_89c;
          auVar67._0_4_ = local_8a0;
          auVar67._8_4_ = uStack_898;
          auVar67._12_4_ = uStack_894;
          auVar67._16_4_ = uStack_890;
          auVar67._20_4_ = uStack_88c;
          auVar67._24_4_ = uStack_888;
          auVar67._28_4_ = uStack_884;
          auVar117 = vandps_avx(ZEXT1632(auVar192),auVar67);
          auVar155._8_4_ = 0x3e99999a;
          auVar155._0_8_ = 0x3e99999a3e99999a;
          auVar155._12_4_ = 0x3e99999a;
          auVar155._16_4_ = 0x3e99999a;
          auVar155._20_4_ = 0x3e99999a;
          auVar155._24_4_ = 0x3e99999a;
          auVar155._28_4_ = 0x3e99999a;
          auVar117 = vcmpps_avx(auVar117,auVar155,1);
          auVar117 = vorps_avx(auVar117,local_5a0);
          auVar156._8_4_ = 3;
          auVar156._0_8_ = 0x300000003;
          auVar156._12_4_ = 3;
          auVar156._16_4_ = 3;
          auVar156._20_4_ = 3;
          auVar156._24_4_ = 3;
          auVar156._28_4_ = 3;
          auVar176._8_4_ = 2;
          auVar176._0_8_ = 0x200000002;
          auVar176._12_4_ = 2;
          auVar176._16_4_ = 2;
          auVar176._20_4_ = 2;
          auVar176._24_4_ = 2;
          auVar176._28_4_ = 2;
          auVar117 = vblendvps_avx(auVar176,auVar156,auVar117);
          uVar98 = (undefined4)uVar99;
          local_5c0._4_4_ = uVar98;
          local_5c0._0_4_ = uVar98;
          local_5c0._8_4_ = uVar98;
          local_5c0._12_4_ = uVar98;
          local_5c0._16_4_ = uVar98;
          local_5c0._20_4_ = uVar98;
          local_5c0._24_4_ = uVar98;
          local_5c0._28_4_ = uVar98;
          local_560 = vpcmpgtd_avx2(auVar117,local_5c0);
          local_5e0 = vpandn_avx2(local_560,local_540);
          auVar117 = local_540 & ~local_560;
          local_640._0_8_ = uVar99;
          auVar124 = _local_2c0;
          if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar117 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar117 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar117 >> 0x7f,0) != '\0') ||
                (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar117 >> 0xbf,0) != '\0') ||
              (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar117[0x1f] < '\0') {
            auVar261 = vminps_avx(local_ae0,local_b00);
            auVar192 = vmaxps_avx(local_ae0,local_b00);
            auVar112 = vminps_avx(local_af0,_local_b10);
            auVar7 = vminps_avx(auVar261,auVar112);
            auVar261 = vmaxps_avx(local_af0,_local_b10);
            auVar112 = vmaxps_avx(auVar192,auVar261);
            auVar192 = vandps_avx(auVar7,local_980);
            auVar261 = vandps_avx(auVar112,local_980);
            auVar192 = vmaxps_avx(auVar192,auVar261);
            auVar261 = vmovshdup_avx(auVar192);
            auVar261 = vmaxss_avx(auVar261,auVar192);
            auVar192 = vshufpd_avx(auVar192,auVar192,1);
            auVar192 = vmaxss_avx(auVar192,auVar261);
            local_940._4_24_ = auVar263._4_24_;
            local_940._0_4_ = auVar192._0_4_ * 1.9073486e-06;
            local_940._28_4_ = 0;
            local_7e0._0_16_ = vshufps_avx(auVar112,auVar112,0xff);
            local_7e0._16_16_ = auVar11._16_16_;
            local_840._4_4_ = (float)local_860._4_4_ + (float)local_7c0._4_4_;
            local_840._0_4_ = (float)local_860._0_4_ + (float)local_7c0._0_4_;
            fStack_838 = fStack_858 + fStack_7b8;
            fStack_834 = fStack_854 + fStack_7b4;
            fStack_830 = fStack_850 + fStack_7b0;
            fStack_82c = fStack_84c + fStack_7ac;
            fStack_828 = fStack_848 + fStack_7a8;
            fStack_824 = fStack_844 + fStack_7a4;
            local_b40 = _local_2c0;
            do {
              auVar157._8_4_ = 0x7f800000;
              auVar157._0_8_ = 0x7f8000007f800000;
              auVar157._12_4_ = 0x7f800000;
              auVar157._16_4_ = 0x7f800000;
              auVar157._20_4_ = 0x7f800000;
              auVar157._24_4_ = 0x7f800000;
              auVar157._28_4_ = 0x7f800000;
              auVar117 = vblendvps_avx(auVar157,_local_860,local_5e0);
              auVar124 = vshufps_avx(auVar117,auVar117,0xb1);
              auVar124 = vminps_avx(auVar117,auVar124);
              auVar6 = vshufpd_avx(auVar124,auVar124,5);
              auVar124 = vminps_avx(auVar124,auVar6);
              auVar6 = vpermpd_avx2(auVar124,0x4e);
              auVar124 = vminps_avx(auVar124,auVar6);
              auVar124 = vcmpps_avx(auVar117,auVar124,0);
              auVar6 = local_5e0 & auVar124;
              auVar117 = local_5e0;
              if ((((((((auVar6 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar6 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar6 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar6 >> 0x7f,0) != '\0') ||
                    (auVar6 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar6 >> 0xbf,0) != '\0') ||
                  (auVar6 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar6[0x1f] < '\0') {
                auVar117 = vandps_avx(auVar124,local_5e0);
              }
              uVar91 = vmovmskps_avx(auVar117);
              iVar12 = 0;
              for (; (uVar91 & 1) == 0; uVar91 = uVar91 >> 1 | 0x80000000) {
                iVar12 = iVar12 + 1;
              }
              uVar92 = iVar12 << 2;
              *(undefined4 *)(local_5e0 + uVar92) = 0;
              uVar91 = *(uint *)(local_500 + uVar92);
              uVar92 = *(uint *)(local_300 + uVar92);
              fVar204 = local_b44;
              if ((float)local_990._0_4_ < 0.0) {
                fVar204 = sqrtf((float)local_990._0_4_);
              }
              auVar277 = ZEXT464(uVar92);
              auVar267 = ZEXT464(uVar91);
              local_a00._0_4_ = fVar204 * 1.9073486e-06;
              lVar96 = 4;
              do {
                fVar219 = auVar267._0_4_;
                fVar291 = 1.0 - fVar219;
                local_a60._0_16_ = ZEXT416((uint)fVar291);
                fVar220 = fVar291 * fVar291 * fVar291;
                fVar290 = fVar219 * fVar219;
                fVar218 = fVar219 * fVar290;
                auVar261 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar220),
                                           ZEXT416((uint)fVar218));
                fVar217 = fVar219 * fVar291;
                auVar112 = vfmadd231ss_fma(ZEXT416((uint)(fVar219 * fVar217 * 6.0)),
                                           ZEXT416((uint)(fVar291 * fVar217)),
                                           SUB6416(ZEXT464(0x41400000),0));
                auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar291 * fVar217 * 6.0)),
                                         SUB6416(ZEXT464(0x41400000),0),
                                         ZEXT416((uint)(fVar219 * fVar217)));
                auVar192 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar218),
                                           ZEXT416((uint)fVar220));
                fVar204 = (auVar192._0_4_ + auVar7._0_4_) * 0.16666667;
                fVar218 = fVar218 * 0.16666667;
                auVar136._0_4_ = fVar218 * (float)local_b10._0_4_;
                auVar136._4_4_ = fVar218 * (float)local_b10._4_4_;
                auVar136._8_4_ = fVar218 * fStack_b08;
                auVar136._12_4_ = fVar218 * fStack_b04;
                auVar185._4_4_ = fVar204;
                auVar185._0_4_ = fVar204;
                auVar185._8_4_ = fVar204;
                auVar185._12_4_ = fVar204;
                auVar192 = vfmadd132ps_fma(auVar185,auVar136,local_af0);
                fVar204 = (auVar261._0_4_ + auVar112._0_4_) * 0.16666667;
                auVar137._4_4_ = fVar204;
                auVar137._0_4_ = fVar204;
                auVar137._8_4_ = fVar204;
                auVar137._12_4_ = fVar204;
                auVar192 = vfmadd132ps_fma(auVar137,auVar192,local_b00);
                fVar204 = auVar277._0_4_;
                auVar166._4_4_ = fVar204;
                auVar166._0_4_ = fVar204;
                auVar166._8_4_ = fVar204;
                auVar166._12_4_ = fVar204;
                auVar261 = vfmadd213ps_fma(auVar166,local_970,_DAT_01feba10);
                fVar220 = fVar220 * 0.16666667;
                auVar107._4_4_ = fVar220;
                auVar107._0_4_ = fVar220;
                auVar107._8_4_ = fVar220;
                auVar107._12_4_ = fVar220;
                auVar192 = vfmadd132ps_fma(auVar107,auVar192,local_ae0);
                local_740._0_16_ = auVar192;
                auVar192 = vsubps_avx(auVar261,auVar192);
                _local_a40 = auVar192;
                auVar192 = vdpps_avx(auVar192,auVar192,0x7f);
                fVar218 = auVar192._0_4_;
                auVar261 = auVar267._0_16_;
                if (fVar218 < 0.0) {
                  local_a60._0_16_ = ZEXT416((uint)fVar291);
                  local_a80._0_4_ = fVar290;
                  local_9c0._0_4_ = fVar217;
                  auVar242._0_4_ = sqrtf(fVar218);
                  auVar242._4_60_ = extraout_var;
                  auVar112 = auVar242._0_16_;
                  fVar217 = (float)local_9c0._0_4_;
                  fVar290 = (float)local_a80._0_4_;
                }
                else {
                  auVar112 = vsqrtss_avx(auVar192,auVar192);
                }
                fVar220 = local_a60._0_4_;
                auVar108._4_4_ = fVar220;
                auVar108._0_4_ = fVar220;
                auVar108._8_4_ = fVar220;
                auVar108._12_4_ = fVar220;
                auVar298 = vfnmsub213ss_fma(auVar261,auVar261,ZEXT416((uint)(fVar217 * 4.0)));
                auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar217 * 4.0)),local_a60._0_16_,
                                         local_a60._0_16_);
                fVar217 = fVar220 * -fVar220 * 0.5;
                fVar220 = auVar298._0_4_ * 0.5;
                fVar291 = auVar7._0_4_ * 0.5;
                fVar290 = fVar290 * 0.5;
                auVar226._0_4_ = (float)local_b10._0_4_ * fVar290;
                auVar226._4_4_ = (float)local_b10._4_4_ * fVar290;
                auVar226._8_4_ = fStack_b08 * fVar290;
                auVar226._12_4_ = fStack_b04 * fVar290;
                auVar186._4_4_ = fVar291;
                auVar186._0_4_ = fVar291;
                auVar186._8_4_ = fVar291;
                auVar186._12_4_ = fVar291;
                auVar7 = vfmadd213ps_fma(auVar186,local_af0,auVar226);
                auVar207._4_4_ = fVar220;
                auVar207._0_4_ = fVar220;
                auVar207._8_4_ = fVar220;
                auVar207._12_4_ = fVar220;
                auVar7 = vfmadd213ps_fma(auVar207,local_b00,auVar7);
                auVar280._4_4_ = fVar217;
                auVar280._0_4_ = fVar217;
                auVar280._8_4_ = fVar217;
                auVar280._12_4_ = fVar217;
                auVar292 = vfmadd213ps_fma(auVar280,local_ae0,auVar7);
                auVar7 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_a60._0_16_,auVar261);
                auVar261 = vfmadd231ss_fma(local_a60._0_16_,auVar261,SUB6416(ZEXT464(0xc0000000),0))
                ;
                auVar187._0_4_ = (float)local_b10._0_4_ * fVar219;
                auVar187._4_4_ = (float)local_b10._4_4_ * fVar219;
                auVar187._8_4_ = fStack_b08 * fVar219;
                auVar187._12_4_ = fStack_b04 * fVar219;
                uVar98 = auVar261._0_4_;
                auVar208._4_4_ = uVar98;
                auVar208._0_4_ = uVar98;
                auVar208._8_4_ = uVar98;
                auVar208._12_4_ = uVar98;
                auVar261 = vfmadd213ps_fma(auVar208,local_af0,auVar187);
                auVar167._0_4_ = auVar7._0_4_;
                auVar167._4_4_ = auVar167._0_4_;
                auVar167._8_4_ = auVar167._0_4_;
                auVar167._12_4_ = auVar167._0_4_;
                auVar261 = vfmadd213ps_fma(auVar167,local_b00,auVar261);
                auVar106 = vfmadd231ps_fma(auVar261,local_ae0,auVar108);
                auVar7 = vdpps_avx(auVar292,auVar292,0x7f);
                auVar261 = vblendps_avx(auVar7,_DAT_01feba10,0xe);
                auVar298 = vrsqrtss_avx(auVar261,auVar261);
                fVar217 = auVar298._0_4_;
                fVar290 = auVar7._0_4_;
                fVar217 = fVar217 * 1.5 + fVar290 * -0.5 * fVar217 * fVar217 * fVar217;
                auVar298 = vdpps_avx(auVar292,auVar106,0x7f);
                auVar168._0_4_ = auVar106._0_4_ * fVar290;
                auVar168._4_4_ = auVar106._4_4_ * fVar290;
                auVar168._8_4_ = auVar106._8_4_ * fVar290;
                auVar168._12_4_ = auVar106._12_4_ * fVar290;
                fVar220 = auVar298._0_4_;
                auVar227._0_4_ = auVar292._0_4_ * fVar220;
                auVar227._4_4_ = auVar292._4_4_ * fVar220;
                fVar291 = auVar292._8_4_;
                auVar227._8_4_ = fVar291 * fVar220;
                fVar243 = auVar292._12_4_;
                auVar227._12_4_ = fVar243 * fVar220;
                auVar298 = vsubps_avx(auVar168,auVar227);
                auVar261 = vrcpss_avx(auVar261,auVar261);
                auVar106 = vfnmadd213ss_fma(auVar261,auVar7,ZEXT416(0x40000000));
                fVar220 = auVar261._0_4_ * auVar106._0_4_;
                auVar261 = vmaxss_avx(ZEXT416((uint)local_940._0_4_),
                                      ZEXT416((uint)(fVar204 * (float)local_a00._0_4_)));
                local_aa0._0_8_ = auVar292._0_8_ ^ 0x8000000080000000;
                local_aa0._8_4_ = -fVar291;
                local_aa0._12_4_ = -fVar243;
                auVar188._0_4_ = fVar217 * auVar298._0_4_ * fVar220;
                auVar188._4_4_ = fVar217 * auVar298._4_4_ * fVar220;
                auVar188._8_4_ = fVar217 * auVar298._8_4_ * fVar220;
                auVar188._12_4_ = fVar217 * auVar298._12_4_ * fVar220;
                auVar236._0_4_ = auVar292._0_4_ * fVar217;
                auVar236._4_4_ = auVar292._4_4_ * fVar217;
                auVar236._8_4_ = fVar291 * fVar217;
                auVar236._12_4_ = fVar243 * fVar217;
                local_a60._0_16_ = auVar292;
                local_a80._0_4_ = auVar261._0_4_;
                if (fVar290 < -fVar290) {
                  local_9c0._0_4_ = auVar112._0_4_;
                  local_9e0._0_16_ = auVar236;
                  local_960._0_16_ = auVar188;
                  fVar217 = sqrtf(fVar290);
                  auVar261 = ZEXT416((uint)local_a80._0_4_);
                  auVar112 = ZEXT416((uint)local_9c0._0_4_);
                  auVar188 = local_960._0_16_;
                  auVar236 = local_9e0._0_16_;
                }
                else {
                  auVar7 = vsqrtss_avx(auVar7,auVar7);
                  fVar217 = auVar7._0_4_;
                }
                auVar7 = vdpps_avx(_local_a40,auVar236,0x7f);
                auVar106 = vfmadd213ss_fma(ZEXT416((uint)local_940._0_4_),auVar112,auVar261);
                auVar298 = vdpps_avx(local_aa0._0_16_,auVar236,0x7f);
                auVar292 = vdpps_avx(_local_a40,auVar188,0x7f);
                local_9c0._0_16_ = vdpps_avx(local_970,auVar236,0x7f);
                auVar106 = vfmadd213ss_fma(ZEXT416((uint)(auVar112._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_940._0_4_ / fVar217)),
                                           auVar106);
                auVar289 = ZEXT1664(auVar106);
                fVar217 = auVar298._0_4_ + auVar292._0_4_;
                auVar109._0_4_ = auVar7._0_4_ * auVar7._0_4_;
                auVar109._4_4_ = auVar7._4_4_ * auVar7._4_4_;
                auVar109._8_4_ = auVar7._8_4_ * auVar7._8_4_;
                auVar109._12_4_ = auVar7._12_4_ * auVar7._12_4_;
                auVar112 = vdpps_avx(_local_a40,local_aa0._0_16_,0x7f);
                auVar292 = vsubps_avx(auVar192,auVar109);
                auVar298 = vrsqrtss_avx(auVar292,auVar292);
                fVar290 = auVar292._0_4_;
                fVar220 = auVar298._0_4_;
                fVar220 = fVar220 * 1.5 + fVar290 * -0.5 * fVar220 * fVar220 * fVar220;
                auVar298 = vdpps_avx(_local_a40,local_970,0x7f);
                local_aa0._0_16_ = vfnmadd231ss_fma(auVar112,auVar7,ZEXT416((uint)fVar217));
                auVar112 = vfnmadd231ss_fma(auVar298,auVar7,local_9c0._0_16_);
                if (fVar290 < 0.0) {
                  local_9e0._0_16_ = auVar7;
                  local_960._0_4_ = auVar106._0_4_;
                  local_760._0_16_ = ZEXT416((uint)fVar217);
                  local_780._0_4_ = fVar220;
                  local_7a0._0_16_ = auVar112;
                  fVar290 = sqrtf(fVar290);
                  auVar289 = ZEXT464((uint)local_960._0_4_);
                  auVar261 = ZEXT416((uint)local_a80._0_4_);
                  fVar220 = (float)local_780._0_4_;
                  auVar112 = local_7a0._0_16_;
                  auVar7 = local_9e0._0_16_;
                  auVar298 = local_760._0_16_;
                }
                else {
                  auVar298 = vsqrtss_avx(auVar292,auVar292);
                  fVar290 = auVar298._0_4_;
                  auVar298 = ZEXT416((uint)fVar217);
                }
                auVar283 = ZEXT1664(local_a60._0_16_);
                auVar292 = vpermilps_avx(local_740._0_16_,0xff);
                auVar106 = vshufps_avx(local_a60._0_16_,local_a60._0_16_,0xff);
                auVar105 = vfmsub213ss_fma(local_aa0._0_16_,ZEXT416((uint)fVar220),auVar106);
                auVar242 = ZEXT1664(auVar105);
                auVar189._0_8_ = local_9c0._0_8_ ^ 0x8000000080000000;
                auVar189._8_4_ = local_9c0._8_4_ ^ 0x80000000;
                auVar189._12_4_ = local_9c0._12_4_ ^ 0x80000000;
                auVar209._0_8_ = auVar105._0_8_ ^ 0x8000000080000000;
                auVar209._8_4_ = auVar105._8_4_ ^ 0x80000000;
                auVar209._12_4_ = auVar105._12_4_ ^ 0x80000000;
                auVar112 = ZEXT416((uint)(auVar112._0_4_ * fVar220));
                auVar138 = vfmsub231ss_fma(ZEXT416((uint)(local_9c0._0_4_ * auVar105._0_4_)),
                                           auVar298,auVar112);
                auVar112 = vinsertps_avx(auVar112,auVar189,0x10);
                uVar98 = auVar138._0_4_;
                auVar190._4_4_ = uVar98;
                auVar190._0_4_ = uVar98;
                auVar190._8_4_ = uVar98;
                auVar190._12_4_ = uVar98;
                auVar112 = vdivps_avx(auVar112,auVar190);
                auVar138 = ZEXT416((uint)(fVar290 - auVar292._0_4_));
                auVar292 = vinsertps_avx(auVar7,auVar138,0x10);
                auVar169._0_4_ = auVar292._0_4_ * auVar112._0_4_;
                auVar169._4_4_ = auVar292._4_4_ * auVar112._4_4_;
                auVar169._8_4_ = auVar292._8_4_ * auVar112._8_4_;
                auVar169._12_4_ = auVar292._12_4_ * auVar112._12_4_;
                auVar112 = vinsertps_avx(auVar209,auVar298,0x1c);
                auVar112 = vdivps_avx(auVar112,auVar190);
                auVar191._0_4_ = auVar292._0_4_ * auVar112._0_4_;
                auVar191._4_4_ = auVar292._4_4_ * auVar112._4_4_;
                auVar191._8_4_ = auVar292._8_4_ * auVar112._8_4_;
                auVar191._12_4_ = auVar292._12_4_ * auVar112._12_4_;
                auVar112 = vhaddps_avx(auVar169,auVar169);
                auVar298 = vhaddps_avx(auVar191,auVar191);
                fVar219 = fVar219 - auVar112._0_4_;
                auVar267 = ZEXT464((uint)fVar219);
                fVar204 = fVar204 - auVar298._0_4_;
                auVar277 = ZEXT464((uint)fVar204);
                auVar112 = vandps_avx(auVar7,local_980);
                if (auVar289._0_4_ <= auVar112._0_4_) {
LAB_01663e59:
                  bVar50 = false;
                }
                else {
                  auVar112 = vfmadd231ss_fma(ZEXT416((uint)(auVar261._0_4_ + auVar289._0_4_)),
                                             local_7e0._0_16_,ZEXT416(0x36000000));
                  auVar261 = vandps_avx(auVar138,local_980);
                  if (auVar112._0_4_ <= auVar261._0_4_) goto LAB_01663e59;
                  fVar204 = fVar204 + (float)local_910._0_4_;
                  auVar277 = ZEXT464((uint)fVar204);
                  bVar50 = true;
                  if ((((fVar101 <= fVar204) &&
                       (fVar217 = *(float *)(ray + k * 4 + 0x80), fVar204 <= fVar217)) &&
                      (0.0 <= fVar219)) && (fVar219 <= 1.0)) {
                    auVar192 = vrsqrtss_avx(auVar192,auVar192);
                    fVar220 = auVar192._0_4_;
                    auVar97 = (undefined1  [8])(context->scene->geometries).items[uVar95].ptr;
                    if ((((Geometry *)auVar97)->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      fVar218 = fVar220 * 1.5 + fVar218 * -0.5 * fVar220 * fVar220 * fVar220;
                      auVar139._0_4_ = fVar218 * (float)local_a40._0_4_;
                      auVar139._4_4_ = fVar218 * (float)local_a40._4_4_;
                      auVar139._8_4_ = fVar218 * fStack_a38;
                      auVar139._12_4_ = fVar218 * fStack_a34;
                      auVar7 = vfmadd213ps_fma(auVar106,auVar139,local_a60._0_16_);
                      auVar192 = vshufps_avx(auVar139,auVar139,0xc9);
                      auVar261 = vshufps_avx(local_a60._0_16_,local_a60._0_16_,0xc9);
                      auVar140._0_4_ = auVar139._0_4_ * auVar261._0_4_;
                      auVar140._4_4_ = auVar139._4_4_ * auVar261._4_4_;
                      auVar140._8_4_ = auVar139._8_4_ * auVar261._8_4_;
                      auVar140._12_4_ = auVar139._12_4_ * auVar261._12_4_;
                      auVar112 = vfmsub231ps_fma(auVar140,local_a60._0_16_,auVar192);
                      auVar192 = vshufps_avx(auVar112,auVar112,0xc9);
                      auVar261 = vshufps_avx(auVar7,auVar7,0xc9);
                      auVar112 = vshufps_avx(auVar112,auVar112,0xd2);
                      auVar110._0_4_ = auVar7._0_4_ * auVar112._0_4_;
                      auVar110._4_4_ = auVar7._4_4_ * auVar112._4_4_;
                      auVar110._8_4_ = auVar7._8_4_ * auVar112._8_4_;
                      auVar110._12_4_ = auVar7._12_4_ * auVar112._12_4_;
                      auVar192 = vfmsub231ps_fma(auVar110,auVar192,auVar261);
                      uVar98 = auVar192._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (((Geometry *)auVar97)->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = fVar204;
                        uVar4 = vextractps_avx(auVar192,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar4;
                        uVar4 = vextractps_avx(auVar192,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar4;
                        *(undefined4 *)(ray + k * 4 + 0xe0) = uVar98;
                        *(float *)(ray + k * 4 + 0xf0) = fVar219;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(undefined4 *)(ray + k * 4 + 0x110) = uVar1;
                        *(uint *)(ray + k * 4 + 0x120) = uVar95;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        auVar141._4_4_ = fVar219;
                        auVar141._0_4_ = fVar219;
                        auVar141._8_4_ = fVar219;
                        auVar141._12_4_ = fVar219;
                        local_700 = (RTCHitN  [16])vshufps_avx(auVar192,auVar192,0x55);
                        auVar192 = vshufps_avx(auVar192,auVar192,0xaa);
                        auStack_6f0 = auVar192;
                        local_6e0 = uVar98;
                        uStack_6dc = uVar98;
                        uStack_6d8 = uVar98;
                        uStack_6d4 = uVar98;
                        local_6d0 = auVar141;
                        local_6c0 = ZEXT416(0) << 0x20;
                        local_6b0 = CONCAT44(uStack_71c,local_720);
                        uStack_6a8 = CONCAT44(uStack_714,uStack_718);
                        local_6a0._4_4_ = uStack_70c;
                        local_6a0._0_4_ = local_710;
                        local_6a0._8_4_ = uStack_708;
                        local_6a0._12_4_ = uStack_704;
                        vpcmpeqd_avx2(ZEXT1632(local_6a0),ZEXT1632(local_6a0));
                        uStack_68c = context->user->instID[0];
                        local_690 = uStack_68c;
                        uStack_688 = uStack_68c;
                        uStack_684 = uStack_68c;
                        uStack_680 = context->user->instPrimID[0];
                        uStack_67c = uStack_680;
                        uStack_678 = uStack_680;
                        uStack_674 = uStack_680;
                        *(float *)(ray + k * 4 + 0x80) = fVar204;
                        local_b60 = *local_a08;
                        uStack_b58 = local_a08[1];
                        local_ad0.valid = (int *)&local_b60;
                        local_ad0.geometryUserPtr = ((Geometry *)auVar97)->userPtr;
                        local_ad0.context = context->user;
                        local_ad0.hit = local_700;
                        local_ad0.N = 4;
                        local_ad0.ray = (RTCRayN *)ray;
                        if (((Geometry *)auVar97)->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          local_a40 = auVar97;
                          auVar242 = ZEXT1664(auVar105);
                          auVar283 = ZEXT1664(local_a60._0_16_);
                          auVar289 = ZEXT1664(auVar289._0_16_);
                          (*((Geometry *)auVar97)->intersectionFilterN)(&local_ad0);
                          auVar267._8_56_ = extraout_var_01;
                          auVar267._0_8_ = extraout_XMM1_Qa;
                          auVar141 = auVar267._0_16_;
                          auVar277 = ZEXT1664(ZEXT416((uint)fVar204));
                          auVar267 = ZEXT1664(ZEXT416((uint)fVar219));
                          auVar97 = local_a40;
                        }
                        auVar58._8_8_ = uStack_b58;
                        auVar58._0_8_ = local_b60;
                        if (auVar58 == (undefined1  [16])0x0) {
                          auVar192 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar261 = vpcmpeqd_avx(auVar141,auVar141);
                          auVar192 = auVar192 ^ auVar261;
                        }
                        else {
                          p_Var5 = context->args->filter;
                          auVar261 = vpcmpeqd_avx(auVar192,auVar192);
                          if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((((Geometry *)auVar97)->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar242 = ZEXT1664(auVar242._0_16_);
                            auVar283 = ZEXT1664(auVar283._0_16_);
                            auVar289 = ZEXT1664(auVar289._0_16_);
                            (*p_Var5)(&local_ad0);
                            auVar277 = ZEXT1664(ZEXT416((uint)fVar204));
                            auVar267 = ZEXT1664(ZEXT416((uint)fVar219));
                            auVar261 = vpcmpeqd_avx(auVar261,auVar261);
                          }
                          auVar59._8_8_ = uStack_b58;
                          auVar59._0_8_ = local_b60;
                          auVar112 = vpcmpeqd_avx(auVar59,_DAT_01feba10);
                          auVar192 = auVar112 ^ auVar261;
                          if (auVar59 != (undefined1  [16])0x0) {
                            auVar112 = auVar112 ^ auVar261;
                            auVar261 = vmaskmovps_avx(auVar112,*(undefined1 (*) [16])local_ad0.hit);
                            *(undefined1 (*) [16])(local_ad0.ray + 0xc0) = auVar261;
                            auVar261 = vmaskmovps_avx(auVar112,*(undefined1 (*) [16])
                                                                (local_ad0.hit + 0x10));
                            *(undefined1 (*) [16])(local_ad0.ray + 0xd0) = auVar261;
                            auVar261 = vmaskmovps_avx(auVar112,*(undefined1 (*) [16])
                                                                (local_ad0.hit + 0x20));
                            *(undefined1 (*) [16])(local_ad0.ray + 0xe0) = auVar261;
                            auVar261 = vmaskmovps_avx(auVar112,*(undefined1 (*) [16])
                                                                (local_ad0.hit + 0x30));
                            *(undefined1 (*) [16])(local_ad0.ray + 0xf0) = auVar261;
                            auVar261 = vmaskmovps_avx(auVar112,*(undefined1 (*) [16])
                                                                (local_ad0.hit + 0x40));
                            *(undefined1 (*) [16])(local_ad0.ray + 0x100) = auVar261;
                            auVar261 = vmaskmovps_avx(auVar112,*(undefined1 (*) [16])
                                                                (local_ad0.hit + 0x50));
                            *(undefined1 (*) [16])(local_ad0.ray + 0x110) = auVar261;
                            auVar261 = vmaskmovps_avx(auVar112,*(undefined1 (*) [16])
                                                                (local_ad0.hit + 0x60));
                            *(undefined1 (*) [16])(local_ad0.ray + 0x120) = auVar261;
                            auVar261 = vmaskmovps_avx(auVar112,*(undefined1 (*) [16])
                                                                (local_ad0.hit + 0x70));
                            *(undefined1 (*) [16])(local_ad0.ray + 0x130) = auVar261;
                            auVar261 = vmaskmovps_avx(auVar112,*(undefined1 (*) [16])
                                                                (local_ad0.hit + 0x80));
                            *(undefined1 (*) [16])(local_ad0.ray + 0x140) = auVar261;
                          }
                        }
                        auVar142._8_8_ = 0x100000001;
                        auVar142._0_8_ = 0x100000001;
                        if ((auVar142 & auVar192) == (undefined1  [16])0x0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar217;
                        }
                      }
                    }
                  }
                }
                auVar117 = local_5e0;
                bVar100 = lVar96 != 0;
                lVar96 = lVar96 + -1;
              } while ((!bVar50) && (bVar100));
              uVar98 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar121._4_4_ = uVar98;
              auVar121._0_4_ = uVar98;
              auVar121._8_4_ = uVar98;
              auVar121._12_4_ = uVar98;
              auVar121._16_4_ = uVar98;
              auVar121._20_4_ = uVar98;
              auVar121._24_4_ = uVar98;
              auVar121._28_4_ = uVar98;
              auVar124 = vcmpps_avx(_local_840,auVar121,2);
              local_5e0 = vandps_avx(auVar124,local_5e0);
              auVar117 = auVar117 & auVar124;
              uVar99 = local_640._0_8_;
              auVar124 = local_b40;
            } while ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar117 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar117 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar117 >> 0x7f,0) != '\0') ||
                       (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar117 >> 0xbf,0) != '\0') ||
                     (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar117[0x1f] < '\0');
          }
          auVar49._4_4_ = (float)local_660._4_4_ * (float)local_880._4_4_;
          auVar49._0_4_ = (float)local_660._0_4_ * (float)local_880._0_4_;
          auVar49._8_4_ = fStack_658 * fStack_878;
          auVar49._12_4_ = fStack_654 * fStack_874;
          auVar49._16_4_ = fStack_650 * fStack_870;
          auVar49._20_4_ = fStack_64c * fStack_86c;
          auVar49._24_4_ = fStack_648 * fStack_868;
          auVar49._28_4_ = uStack_644;
          auVar192 = vfmadd132ps_fma(local_8e0,auVar49,_local_820);
          auVar192 = vfmadd132ps_fma(local_8c0,ZEXT1632(auVar192),_local_800);
          auVar68._4_4_ = uStack_89c;
          auVar68._0_4_ = local_8a0;
          auVar68._8_4_ = uStack_898;
          auVar68._12_4_ = uStack_894;
          auVar68._16_4_ = uStack_890;
          auVar68._20_4_ = uStack_88c;
          auVar68._24_4_ = uStack_888;
          auVar68._28_4_ = uStack_884;
          auVar117 = vandps_avx(ZEXT1632(auVar192),auVar68);
          auVar158._8_4_ = 0x3e99999a;
          auVar158._0_8_ = 0x3e99999a3e99999a;
          auVar158._12_4_ = 0x3e99999a;
          auVar158._16_4_ = 0x3e99999a;
          auVar158._20_4_ = 0x3e99999a;
          auVar158._24_4_ = 0x3e99999a;
          auVar158._28_4_ = 0x3e99999a;
          auVar117 = vcmpps_avx(auVar117,auVar158,1);
          auVar6 = vorps_avx(auVar117,local_5a0);
          auVar159._0_4_ = auVar124._0_4_ + (float)local_7c0._0_4_;
          auVar159._4_4_ = auVar124._4_4_ + (float)local_7c0._4_4_;
          auVar159._8_4_ = auVar124._8_4_ + fStack_7b8;
          auVar159._12_4_ = auVar124._12_4_ + fStack_7b4;
          auVar159._16_4_ = auVar124._16_4_ + fStack_7b0;
          auVar159._20_4_ = auVar124._20_4_ + fStack_7ac;
          auVar159._24_4_ = auVar124._24_4_ + fStack_7a8;
          auVar159._28_4_ = auVar124._28_4_ + fStack_7a4;
          uVar98 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar177._4_4_ = uVar98;
          auVar177._0_4_ = uVar98;
          auVar177._8_4_ = uVar98;
          auVar177._12_4_ = uVar98;
          auVar177._16_4_ = uVar98;
          auVar177._20_4_ = uVar98;
          auVar177._24_4_ = uVar98;
          auVar177._28_4_ = uVar98;
          auVar117 = vcmpps_avx(auVar159,auVar177,2);
          local_8c0 = vandps_avx(auVar117,local_580);
          auVar160._8_4_ = 3;
          auVar160._0_8_ = 0x300000003;
          auVar160._12_4_ = 3;
          auVar160._16_4_ = 3;
          auVar160._20_4_ = 3;
          auVar160._24_4_ = 3;
          auVar160._28_4_ = 3;
          auVar178._8_4_ = 2;
          auVar178._0_8_ = 0x200000002;
          auVar178._12_4_ = 2;
          auVar178._16_4_ = 2;
          auVar178._20_4_ = 2;
          auVar178._24_4_ = 2;
          auVar178._28_4_ = 2;
          auVar117 = vblendvps_avx(auVar178,auVar160,auVar6);
          local_8e0 = vpcmpgtd_avx2(auVar117,local_5c0);
          local_600 = vpandn_avx2(local_8e0,local_8c0);
          auVar117 = local_8c0 & ~local_8e0;
          if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar117 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar117 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar117 >> 0x7f,0) != '\0') ||
                (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar117 >> 0xbf,0) != '\0') ||
              (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar117[0x1f] < '\0') {
            auVar261 = vminps_avx(local_ae0,local_b00);
            auVar192 = vmaxps_avx(local_ae0,local_b00);
            auVar112 = vminps_avx(local_af0,_local_b10);
            auVar7 = vminps_avx(auVar261,auVar112);
            auVar261 = vmaxps_avx(local_af0,_local_b10);
            auVar112 = vmaxps_avx(auVar192,auVar261);
            auVar192 = vandps_avx(auVar7,local_980);
            auVar261 = vandps_avx(auVar112,local_980);
            auVar192 = vmaxps_avx(auVar192,auVar261);
            auVar261 = vmovshdup_avx(auVar192);
            auVar261 = vmaxss_avx(auVar261,auVar192);
            auVar192 = vshufpd_avx(auVar192,auVar192,1);
            auVar192 = vmaxss_avx(auVar192,auVar261);
            local_940._0_4_ = auVar192._0_4_ * 1.9073486e-06;
            local_7a0._0_16_ = vshufps_avx(auVar112,auVar112,0xff);
            local_7e0 = _local_2c0;
            local_840._4_4_ = (float)local_2c0._4_4_ + (float)local_7c0._4_4_;
            local_840._0_4_ = (float)local_2c0._0_4_ + (float)local_7c0._0_4_;
            fStack_838 = fStack_2b8 + fStack_7b8;
            fStack_834 = fStack_2b4 + fStack_7b4;
            fStack_830 = fStack_2b0 + fStack_7b0;
            fStack_82c = fStack_2ac + fStack_7ac;
            fStack_828 = fStack_2a8 + fStack_7a8;
            fStack_824 = fStack_2a4 + fStack_7a4;
            do {
              auVar161._8_4_ = 0x7f800000;
              auVar161._0_8_ = 0x7f8000007f800000;
              auVar161._12_4_ = 0x7f800000;
              auVar161._16_4_ = 0x7f800000;
              auVar161._20_4_ = 0x7f800000;
              auVar161._24_4_ = 0x7f800000;
              auVar161._28_4_ = 0x7f800000;
              auVar117 = vblendvps_avx(auVar161,local_7e0,local_600);
              auVar124 = vshufps_avx(auVar117,auVar117,0xb1);
              auVar124 = vminps_avx(auVar117,auVar124);
              auVar6 = vshufpd_avx(auVar124,auVar124,5);
              auVar124 = vminps_avx(auVar124,auVar6);
              auVar6 = vpermpd_avx2(auVar124,0x4e);
              auVar124 = vminps_avx(auVar124,auVar6);
              auVar124 = vcmpps_avx(auVar117,auVar124,0);
              auVar6 = local_600 & auVar124;
              auVar117 = local_600;
              if ((((((((auVar6 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar6 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar6 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar6 >> 0x7f,0) != '\0') ||
                    (auVar6 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar6 >> 0xbf,0) != '\0') ||
                  (auVar6 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar6[0x1f] < '\0') {
                auVar117 = vandps_avx(auVar124,local_600);
              }
              uVar91 = vmovmskps_avx(auVar117);
              iVar12 = 0;
              for (; (uVar91 & 1) == 0; uVar91 = uVar91 >> 1 | 0x80000000) {
                iVar12 = iVar12 + 1;
              }
              uVar92 = iVar12 << 2;
              *(undefined4 *)(local_600 + uVar92) = 0;
              uVar91 = *(uint *)(local_520 + uVar92);
              uVar92 = *(uint *)(local_2a0 + uVar92);
              fVar204 = local_b48;
              if ((float)local_990._0_4_ < 0.0) {
                fVar204 = sqrtf((float)local_990._0_4_);
              }
              auVar277 = ZEXT464(uVar92);
              auVar267 = ZEXT464(uVar91);
              local_9c0._0_4_ = fVar204 * 1.9073486e-06;
              lVar96 = 4;
              do {
                fVar219 = auVar267._0_4_;
                fVar291 = 1.0 - fVar219;
                local_a60._0_16_ = ZEXT416((uint)fVar291);
                fVar220 = fVar291 * fVar291 * fVar291;
                fVar290 = fVar219 * fVar219;
                fVar218 = fVar219 * fVar290;
                auVar261 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar220),
                                           ZEXT416((uint)fVar218));
                fVar217 = fVar219 * fVar291;
                auVar112 = vfmadd231ss_fma(ZEXT416((uint)(fVar219 * fVar217 * 6.0)),
                                           ZEXT416((uint)(fVar291 * fVar217)),
                                           SUB6416(ZEXT464(0x41400000),0));
                auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar291 * fVar217 * 6.0)),
                                         SUB6416(ZEXT464(0x41400000),0),
                                         ZEXT416((uint)(fVar219 * fVar217)));
                auVar192 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar218),
                                           ZEXT416((uint)fVar220));
                fVar204 = (auVar192._0_4_ + auVar7._0_4_) * 0.16666667;
                fVar218 = fVar218 * 0.16666667;
                auVar143._0_4_ = fVar218 * (float)local_b10._0_4_;
                auVar143._4_4_ = fVar218 * (float)local_b10._4_4_;
                auVar143._8_4_ = fVar218 * fStack_b08;
                auVar143._12_4_ = fVar218 * fStack_b04;
                auVar193._4_4_ = fVar204;
                auVar193._0_4_ = fVar204;
                auVar193._8_4_ = fVar204;
                auVar193._12_4_ = fVar204;
                auVar192 = vfmadd132ps_fma(auVar193,auVar143,local_af0);
                fVar204 = (auVar261._0_4_ + auVar112._0_4_) * 0.16666667;
                auVar144._4_4_ = fVar204;
                auVar144._0_4_ = fVar204;
                auVar144._8_4_ = fVar204;
                auVar144._12_4_ = fVar204;
                auVar192 = vfmadd132ps_fma(auVar144,auVar192,local_b00);
                fVar204 = auVar277._0_4_;
                auVar170._4_4_ = fVar204;
                auVar170._0_4_ = fVar204;
                auVar170._8_4_ = fVar204;
                auVar170._12_4_ = fVar204;
                auVar261 = vfmadd213ps_fma(auVar170,local_970,_DAT_01feba10);
                fVar220 = fVar220 * 0.16666667;
                auVar111._4_4_ = fVar220;
                auVar111._0_4_ = fVar220;
                auVar111._8_4_ = fVar220;
                auVar111._12_4_ = fVar220;
                auVar192 = vfmadd132ps_fma(auVar111,auVar192,local_ae0);
                local_740._0_16_ = auVar192;
                auVar192 = vsubps_avx(auVar261,auVar192);
                _local_a40 = auVar192;
                auVar192 = vdpps_avx(auVar192,auVar192,0x7f);
                fVar218 = auVar192._0_4_;
                auVar261 = auVar267._0_16_;
                if (fVar218 < 0.0) {
                  local_a60._0_16_ = ZEXT416((uint)fVar291);
                  local_a80._0_4_ = fVar290;
                  local_aa0._0_4_ = fVar217;
                  auVar277._0_4_ = sqrtf(fVar218);
                  auVar277._4_60_ = extraout_var_00;
                  auVar112 = auVar277._0_16_;
                  fVar217 = (float)local_aa0._0_4_;
                  fVar290 = (float)local_a80._0_4_;
                }
                else {
                  auVar112 = vsqrtss_avx(auVar192,auVar192);
                }
                fVar220 = local_a60._0_4_;
                auVar113._4_4_ = fVar220;
                auVar113._0_4_ = fVar220;
                auVar113._8_4_ = fVar220;
                auVar113._12_4_ = fVar220;
                auVar298 = vfnmsub213ss_fma(auVar261,auVar261,ZEXT416((uint)(fVar217 * 4.0)));
                auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar217 * 4.0)),local_a60._0_16_,
                                         local_a60._0_16_);
                fVar217 = fVar220 * -fVar220 * 0.5;
                fVar220 = auVar298._0_4_ * 0.5;
                fVar291 = auVar7._0_4_ * 0.5;
                fVar290 = fVar290 * 0.5;
                auVar228._0_4_ = (float)local_b10._0_4_ * fVar290;
                auVar228._4_4_ = (float)local_b10._4_4_ * fVar290;
                auVar228._8_4_ = fStack_b08 * fVar290;
                auVar228._12_4_ = fStack_b04 * fVar290;
                auVar194._4_4_ = fVar291;
                auVar194._0_4_ = fVar291;
                auVar194._8_4_ = fVar291;
                auVar194._12_4_ = fVar291;
                auVar7 = vfmadd213ps_fma(auVar194,local_af0,auVar228);
                auVar210._4_4_ = fVar220;
                auVar210._0_4_ = fVar220;
                auVar210._8_4_ = fVar220;
                auVar210._12_4_ = fVar220;
                auVar7 = vfmadd213ps_fma(auVar210,local_b00,auVar7);
                auVar281._4_4_ = fVar217;
                auVar281._0_4_ = fVar217;
                auVar281._8_4_ = fVar217;
                auVar281._12_4_ = fVar217;
                auVar292 = vfmadd213ps_fma(auVar281,local_ae0,auVar7);
                auVar7 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_a60._0_16_,auVar261);
                auVar261 = vfmadd231ss_fma(local_a60._0_16_,auVar261,SUB6416(ZEXT464(0xc0000000),0))
                ;
                auVar195._0_4_ = (float)local_b10._0_4_ * fVar219;
                auVar195._4_4_ = (float)local_b10._4_4_ * fVar219;
                auVar195._8_4_ = fStack_b08 * fVar219;
                auVar195._12_4_ = fStack_b04 * fVar219;
                uVar98 = auVar261._0_4_;
                auVar211._4_4_ = uVar98;
                auVar211._0_4_ = uVar98;
                auVar211._8_4_ = uVar98;
                auVar211._12_4_ = uVar98;
                auVar261 = vfmadd213ps_fma(auVar211,local_af0,auVar195);
                auVar171._0_4_ = auVar7._0_4_;
                auVar171._4_4_ = auVar171._0_4_;
                auVar171._8_4_ = auVar171._0_4_;
                auVar171._12_4_ = auVar171._0_4_;
                auVar261 = vfmadd213ps_fma(auVar171,local_b00,auVar261);
                auVar106 = vfmadd231ps_fma(auVar261,local_ae0,auVar113);
                auVar7 = vdpps_avx(auVar292,auVar292,0x7f);
                auVar261 = vblendps_avx(auVar7,_DAT_01feba10,0xe);
                auVar298 = vrsqrtss_avx(auVar261,auVar261);
                fVar217 = auVar298._0_4_;
                fVar290 = auVar7._0_4_;
                fVar217 = fVar217 * 1.5 + fVar290 * -0.5 * fVar217 * fVar217 * fVar217;
                auVar298 = vdpps_avx(auVar292,auVar106,0x7f);
                auVar172._0_4_ = auVar106._0_4_ * fVar290;
                auVar172._4_4_ = auVar106._4_4_ * fVar290;
                auVar172._8_4_ = auVar106._8_4_ * fVar290;
                auVar172._12_4_ = auVar106._12_4_ * fVar290;
                fVar220 = auVar298._0_4_;
                auVar229._0_4_ = auVar292._0_4_ * fVar220;
                auVar229._4_4_ = auVar292._4_4_ * fVar220;
                fVar291 = auVar292._8_4_;
                auVar229._8_4_ = fVar291 * fVar220;
                fVar243 = auVar292._12_4_;
                auVar229._12_4_ = fVar243 * fVar220;
                auVar298 = vsubps_avx(auVar172,auVar229);
                auVar261 = vrcpss_avx(auVar261,auVar261);
                auVar106 = vfnmadd213ss_fma(auVar261,auVar7,ZEXT416(0x40000000));
                fVar220 = auVar261._0_4_ * auVar106._0_4_;
                auVar261 = vmaxss_avx(ZEXT416((uint)local_940._0_4_),
                                      ZEXT416((uint)(fVar204 * (float)local_9c0._0_4_)));
                auVar237._0_8_ = auVar292._0_8_ ^ 0x8000000080000000;
                auVar237._8_4_ = -fVar291;
                auVar237._12_4_ = -fVar243;
                auVar196._0_4_ = fVar217 * auVar298._0_4_ * fVar220;
                auVar196._4_4_ = fVar217 * auVar298._4_4_ * fVar220;
                auVar196._8_4_ = fVar217 * auVar298._8_4_ * fVar220;
                auVar196._12_4_ = fVar217 * auVar298._12_4_ * fVar220;
                auVar262._0_4_ = auVar292._0_4_ * fVar217;
                auVar262._4_4_ = auVar292._4_4_ * fVar217;
                auVar262._8_4_ = fVar291 * fVar217;
                auVar262._12_4_ = fVar243 * fVar217;
                local_a60._0_16_ = auVar292;
                local_a80._0_4_ = auVar261._0_4_;
                if (fVar290 < -fVar290) {
                  local_aa0._0_4_ = auVar112._0_4_;
                  local_a00._0_16_ = auVar237;
                  local_b40._0_16_ = auVar262;
                  local_9e0._0_16_ = auVar196;
                  fVar217 = sqrtf(fVar290);
                  auVar261 = ZEXT416((uint)local_a80._0_4_);
                  auVar112 = ZEXT416((uint)local_aa0._0_4_);
                  auVar196 = local_9e0._0_16_;
                  auVar237 = local_a00._0_16_;
                  auVar262 = local_b40._0_16_;
                }
                else {
                  auVar7 = vsqrtss_avx(auVar7,auVar7);
                  fVar217 = auVar7._0_4_;
                }
                auVar7 = vdpps_avx(_local_a40,auVar262,0x7f);
                auVar105 = vfmadd213ss_fma(ZEXT416((uint)local_940._0_4_),auVar112,auVar261);
                auVar298 = vdpps_avx(auVar237,auVar262,0x7f);
                auVar292 = vdpps_avx(_local_a40,auVar196,0x7f);
                auVar106 = vdpps_avx(local_970,auVar262,0x7f);
                auVar105 = vfmadd213ss_fma(ZEXT416((uint)(auVar112._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_940._0_4_ / fVar217)),
                                           auVar105);
                auVar289 = ZEXT1664(auVar105);
                fVar217 = auVar298._0_4_ + auVar292._0_4_;
                auVar114._0_4_ = auVar7._0_4_ * auVar7._0_4_;
                auVar114._4_4_ = auVar7._4_4_ * auVar7._4_4_;
                auVar114._8_4_ = auVar7._8_4_ * auVar7._8_4_;
                auVar114._12_4_ = auVar7._12_4_ * auVar7._12_4_;
                auVar112 = vdpps_avx(_local_a40,auVar237,0x7f);
                auVar292 = vsubps_avx(auVar192,auVar114);
                auVar298 = vrsqrtss_avx(auVar292,auVar292);
                fVar290 = auVar292._0_4_;
                fVar220 = auVar298._0_4_;
                fVar220 = fVar220 * 1.5 + fVar290 * -0.5 * fVar220 * fVar220 * fVar220;
                auVar298 = vdpps_avx(_local_a40,local_970,0x7f);
                auVar112 = vfnmadd231ss_fma(auVar112,auVar7,ZEXT416((uint)fVar217));
                auVar298 = vfnmadd231ss_fma(auVar298,auVar7,auVar106);
                if (fVar290 < 0.0) {
                  local_aa0._0_16_ = auVar7;
                  local_a00._0_4_ = auVar105._0_4_;
                  local_b40._0_16_ = ZEXT416((uint)fVar217);
                  local_9e0._0_16_ = auVar106;
                  local_960._0_16_ = auVar112;
                  local_760._0_4_ = fVar220;
                  local_780._0_16_ = auVar298;
                  fVar290 = sqrtf(fVar290);
                  auVar289 = ZEXT464((uint)local_a00._0_4_);
                  auVar261 = ZEXT416((uint)local_a80._0_4_);
                  fVar220 = (float)local_760._0_4_;
                  auVar298 = local_780._0_16_;
                  auVar7 = local_aa0._0_16_;
                  auVar106 = local_9e0._0_16_;
                  auVar112 = local_960._0_16_;
                  auVar292 = local_b40._0_16_;
                }
                else {
                  auVar292 = vsqrtss_avx(auVar292,auVar292);
                  fVar290 = auVar292._0_4_;
                  auVar292 = ZEXT416((uint)fVar217);
                }
                auVar283 = ZEXT1664(auVar7);
                auVar242 = ZEXT1664(local_a60._0_16_);
                auVar138 = vpermilps_avx(local_740._0_16_,0xff);
                auVar105 = vshufps_avx(local_a60._0_16_,local_a60._0_16_,0xff);
                auVar112 = vfmsub213ss_fma(auVar112,ZEXT416((uint)fVar220),auVar105);
                auVar197._0_8_ = auVar106._0_8_ ^ 0x8000000080000000;
                auVar197._8_4_ = auVar106._8_4_ ^ 0x80000000;
                auVar197._12_4_ = auVar106._12_4_ ^ 0x80000000;
                auVar212._0_8_ = auVar112._0_8_ ^ 0x8000000080000000;
                auVar212._8_4_ = auVar112._8_4_ ^ 0x80000000;
                auVar212._12_4_ = auVar112._12_4_ ^ 0x80000000;
                auVar134 = ZEXT416((uint)(auVar298._0_4_ * fVar220));
                auVar298 = vfmsub231ss_fma(ZEXT416((uint)(auVar106._0_4_ * auVar112._0_4_)),auVar292
                                           ,auVar134);
                auVar112 = vinsertps_avx(auVar134,auVar197,0x10);
                uVar98 = auVar298._0_4_;
                auVar198._4_4_ = uVar98;
                auVar198._0_4_ = uVar98;
                auVar198._8_4_ = uVar98;
                auVar198._12_4_ = uVar98;
                auVar112 = vdivps_avx(auVar112,auVar198);
                auVar106 = ZEXT416((uint)(fVar290 - auVar138._0_4_));
                auVar298 = vinsertps_avx(auVar7,auVar106,0x10);
                auVar173._0_4_ = auVar298._0_4_ * auVar112._0_4_;
                auVar173._4_4_ = auVar298._4_4_ * auVar112._4_4_;
                auVar173._8_4_ = auVar298._8_4_ * auVar112._8_4_;
                auVar173._12_4_ = auVar298._12_4_ * auVar112._12_4_;
                auVar112 = vinsertps_avx(auVar212,auVar292,0x1c);
                auVar112 = vdivps_avx(auVar112,auVar198);
                auVar199._0_4_ = auVar298._0_4_ * auVar112._0_4_;
                auVar199._4_4_ = auVar298._4_4_ * auVar112._4_4_;
                auVar199._8_4_ = auVar298._8_4_ * auVar112._8_4_;
                auVar199._12_4_ = auVar298._12_4_ * auVar112._12_4_;
                auVar112 = vhaddps_avx(auVar173,auVar173);
                auVar298 = vhaddps_avx(auVar199,auVar199);
                fVar219 = fVar219 - auVar112._0_4_;
                auVar267 = ZEXT464((uint)fVar219);
                fVar204 = fVar204 - auVar298._0_4_;
                auVar277 = ZEXT464((uint)fVar204);
                auVar112 = vandps_avx(auVar7,local_980);
                if (auVar289._0_4_ <= auVar112._0_4_) {
LAB_01664a52:
                  bVar50 = false;
                }
                else {
                  auVar112 = vfmadd231ss_fma(ZEXT416((uint)(auVar261._0_4_ + auVar289._0_4_)),
                                             local_7a0._0_16_,ZEXT416(0x36000000));
                  auVar261 = vandps_avx(auVar106,local_980);
                  if (auVar112._0_4_ <= auVar261._0_4_) goto LAB_01664a52;
                  fVar204 = fVar204 + (float)local_910._0_4_;
                  auVar277 = ZEXT464((uint)fVar204);
                  bVar50 = true;
                  if ((((fVar101 <= fVar204) &&
                       (fVar217 = *(float *)(ray + k * 4 + 0x80), fVar204 <= fVar217)) &&
                      (0.0 <= fVar219)) && (fVar219 <= 1.0)) {
                    auVar192 = vrsqrtss_avx(auVar192,auVar192);
                    fVar220 = auVar192._0_4_;
                    auVar97 = (undefined1  [8])(context->scene->geometries).items[uVar95].ptr;
                    if ((((Geometry *)auVar97)->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      fVar218 = fVar220 * 1.5 + fVar218 * -0.5 * fVar220 * fVar220 * fVar220;
                      auVar145._0_4_ = fVar218 * (float)local_a40._0_4_;
                      auVar145._4_4_ = fVar218 * (float)local_a40._4_4_;
                      auVar145._8_4_ = fVar218 * fStack_a38;
                      auVar145._12_4_ = fVar218 * fStack_a34;
                      auVar298 = vfmadd213ps_fma(auVar105,auVar145,local_a60._0_16_);
                      auVar192 = vshufps_avx(auVar145,auVar145,0xc9);
                      auVar261 = vshufps_avx(local_a60._0_16_,local_a60._0_16_,0xc9);
                      auVar146._0_4_ = auVar145._0_4_ * auVar261._0_4_;
                      auVar146._4_4_ = auVar145._4_4_ * auVar261._4_4_;
                      auVar146._8_4_ = auVar145._8_4_ * auVar261._8_4_;
                      auVar146._12_4_ = auVar145._12_4_ * auVar261._12_4_;
                      auVar112 = vfmsub231ps_fma(auVar146,local_a60._0_16_,auVar192);
                      auVar192 = vshufps_avx(auVar112,auVar112,0xc9);
                      auVar261 = vshufps_avx(auVar298,auVar298,0xc9);
                      auVar112 = vshufps_avx(auVar112,auVar112,0xd2);
                      auVar115._0_4_ = auVar298._0_4_ * auVar112._0_4_;
                      auVar115._4_4_ = auVar298._4_4_ * auVar112._4_4_;
                      auVar115._8_4_ = auVar298._8_4_ * auVar112._8_4_;
                      auVar115._12_4_ = auVar298._12_4_ * auVar112._12_4_;
                      auVar192 = vfmsub231ps_fma(auVar115,auVar192,auVar261);
                      uVar98 = auVar192._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (((Geometry *)auVar97)->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = fVar204;
                        uVar4 = vextractps_avx(auVar192,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar4;
                        uVar4 = vextractps_avx(auVar192,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar4;
                        *(undefined4 *)(ray + k * 4 + 0xe0) = uVar98;
                        *(float *)(ray + k * 4 + 0xf0) = fVar219;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(undefined4 *)(ray + k * 4 + 0x110) = uVar1;
                        *(uint *)(ray + k * 4 + 0x120) = uVar95;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        auVar147._4_4_ = fVar219;
                        auVar147._0_4_ = fVar219;
                        auVar147._8_4_ = fVar219;
                        auVar147._12_4_ = fVar219;
                        local_700 = (RTCHitN  [16])vshufps_avx(auVar192,auVar192,0x55);
                        auVar192 = vshufps_avx(auVar192,auVar192,0xaa);
                        auStack_6f0 = auVar192;
                        local_6e0 = uVar98;
                        uStack_6dc = uVar98;
                        uStack_6d8 = uVar98;
                        uStack_6d4 = uVar98;
                        local_6d0 = auVar147;
                        local_6c0 = ZEXT416(0) << 0x20;
                        local_6b0 = CONCAT44(uStack_71c,local_720);
                        uStack_6a8 = CONCAT44(uStack_714,uStack_718);
                        local_6a0._4_4_ = uStack_70c;
                        local_6a0._0_4_ = local_710;
                        local_6a0._8_4_ = uStack_708;
                        local_6a0._12_4_ = uStack_704;
                        vpcmpeqd_avx2(ZEXT1632(local_6a0),ZEXT1632(local_6a0));
                        uStack_68c = context->user->instID[0];
                        local_690 = uStack_68c;
                        uStack_688 = uStack_68c;
                        uStack_684 = uStack_68c;
                        uStack_680 = context->user->instPrimID[0];
                        uStack_67c = uStack_680;
                        uStack_678 = uStack_680;
                        uStack_674 = uStack_680;
                        *(float *)(ray + k * 4 + 0x80) = fVar204;
                        local_b60 = *local_a08;
                        uStack_b58 = local_a08[1];
                        local_ad0.valid = (int *)&local_b60;
                        local_ad0.geometryUserPtr = ((Geometry *)auVar97)->userPtr;
                        local_ad0.context = context->user;
                        local_ad0.hit = local_700;
                        local_ad0.N = 4;
                        local_ad0.ray = (RTCRayN *)ray;
                        if (((Geometry *)auVar97)->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          local_a40 = auVar97;
                          auVar242 = ZEXT1664(local_a60._0_16_);
                          auVar283 = ZEXT1664(auVar7);
                          auVar289 = ZEXT1664(auVar289._0_16_);
                          (*((Geometry *)auVar97)->intersectionFilterN)(&local_ad0);
                          auVar180._8_56_ = extraout_var_02;
                          auVar180._0_8_ = extraout_XMM1_Qa_00;
                          auVar147 = auVar180._0_16_;
                          auVar277 = ZEXT1664(ZEXT416((uint)fVar204));
                          auVar267 = ZEXT1664(ZEXT416((uint)fVar219));
                          auVar97 = local_a40;
                        }
                        auVar60._8_8_ = uStack_b58;
                        auVar60._0_8_ = local_b60;
                        if (auVar60 == (undefined1  [16])0x0) {
                          auVar192 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar261 = vpcmpeqd_avx(auVar147,auVar147);
                          auVar192 = auVar192 ^ auVar261;
                        }
                        else {
                          p_Var5 = context->args->filter;
                          auVar261 = vpcmpeqd_avx(auVar192,auVar192);
                          if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((((Geometry *)auVar97)->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar242 = ZEXT1664(auVar242._0_16_);
                            auVar283 = ZEXT1664(auVar283._0_16_);
                            auVar289 = ZEXT1664(auVar289._0_16_);
                            (*p_Var5)(&local_ad0);
                            auVar277 = ZEXT1664(ZEXT416((uint)fVar204));
                            auVar267 = ZEXT1664(ZEXT416((uint)fVar219));
                            auVar261 = vpcmpeqd_avx(auVar261,auVar261);
                          }
                          auVar61._8_8_ = uStack_b58;
                          auVar61._0_8_ = local_b60;
                          auVar112 = vpcmpeqd_avx(auVar61,_DAT_01feba10);
                          auVar192 = auVar112 ^ auVar261;
                          if (auVar61 != (undefined1  [16])0x0) {
                            auVar112 = auVar112 ^ auVar261;
                            auVar261 = vmaskmovps_avx(auVar112,*(undefined1 (*) [16])local_ad0.hit);
                            *(undefined1 (*) [16])(local_ad0.ray + 0xc0) = auVar261;
                            auVar261 = vmaskmovps_avx(auVar112,*(undefined1 (*) [16])
                                                                (local_ad0.hit + 0x10));
                            *(undefined1 (*) [16])(local_ad0.ray + 0xd0) = auVar261;
                            auVar261 = vmaskmovps_avx(auVar112,*(undefined1 (*) [16])
                                                                (local_ad0.hit + 0x20));
                            *(undefined1 (*) [16])(local_ad0.ray + 0xe0) = auVar261;
                            auVar261 = vmaskmovps_avx(auVar112,*(undefined1 (*) [16])
                                                                (local_ad0.hit + 0x30));
                            *(undefined1 (*) [16])(local_ad0.ray + 0xf0) = auVar261;
                            auVar261 = vmaskmovps_avx(auVar112,*(undefined1 (*) [16])
                                                                (local_ad0.hit + 0x40));
                            *(undefined1 (*) [16])(local_ad0.ray + 0x100) = auVar261;
                            auVar261 = vmaskmovps_avx(auVar112,*(undefined1 (*) [16])
                                                                (local_ad0.hit + 0x50));
                            *(undefined1 (*) [16])(local_ad0.ray + 0x110) = auVar261;
                            auVar261 = vmaskmovps_avx(auVar112,*(undefined1 (*) [16])
                                                                (local_ad0.hit + 0x60));
                            *(undefined1 (*) [16])(local_ad0.ray + 0x120) = auVar261;
                            auVar261 = vmaskmovps_avx(auVar112,*(undefined1 (*) [16])
                                                                (local_ad0.hit + 0x70));
                            *(undefined1 (*) [16])(local_ad0.ray + 0x130) = auVar261;
                            auVar261 = vmaskmovps_avx(auVar112,*(undefined1 (*) [16])
                                                                (local_ad0.hit + 0x80));
                            *(undefined1 (*) [16])(local_ad0.ray + 0x140) = auVar261;
                          }
                        }
                        auVar148._8_8_ = 0x100000001;
                        auVar148._0_8_ = 0x100000001;
                        if ((auVar148 & auVar192) == (undefined1  [16])0x0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar217;
                        }
                      }
                    }
                  }
                }
                auVar117 = local_600;
                bVar100 = lVar96 != 0;
                lVar96 = lVar96 + -1;
              } while ((!bVar50) && (bVar100));
              uVar98 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar122._4_4_ = uVar98;
              auVar122._0_4_ = uVar98;
              auVar122._8_4_ = uVar98;
              auVar122._12_4_ = uVar98;
              auVar122._16_4_ = uVar98;
              auVar122._20_4_ = uVar98;
              auVar122._24_4_ = uVar98;
              auVar122._28_4_ = uVar98;
              auVar124 = vcmpps_avx(_local_840,auVar122,2);
              local_600 = vandps_avx(auVar124,local_600);
              auVar117 = auVar117 & auVar124;
              uVar99 = local_640._0_8_;
            } while ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar117 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar117 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar117 >> 0x7f,0) != '\0') ||
                       (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar117 >> 0xbf,0) != '\0') ||
                     (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar117[0x1f] < '\0');
          }
          auVar162._0_4_ = (float)local_7c0._0_4_ + local_300._0_4_;
          auVar162._4_4_ = (float)local_7c0._4_4_ + local_300._4_4_;
          auVar162._8_4_ = fStack_7b8 + local_300._8_4_;
          auVar162._12_4_ = fStack_7b4 + local_300._12_4_;
          auVar162._16_4_ = fStack_7b0 + local_300._16_4_;
          auVar162._20_4_ = fStack_7ac + local_300._20_4_;
          auVar162._24_4_ = fStack_7a8 + local_300._24_4_;
          auVar162._28_4_ = fStack_7a4 + local_300._28_4_;
          uVar98 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar202._4_4_ = uVar98;
          auVar202._0_4_ = uVar98;
          auVar202._8_4_ = uVar98;
          auVar202._12_4_ = uVar98;
          auVar202._16_4_ = uVar98;
          auVar202._20_4_ = uVar98;
          auVar202._24_4_ = uVar98;
          auVar202._28_4_ = uVar98;
          auVar124 = vcmpps_avx(auVar162,auVar202,2);
          auVar117 = vandps_avx(local_560,local_540);
          auVar117 = vandps_avx(auVar124,auVar117);
          auVar214._0_4_ = (float)local_7c0._0_4_ + local_2c0._0_4_;
          auVar214._4_4_ = (float)local_7c0._4_4_ + local_2c0._4_4_;
          auVar214._8_4_ = fStack_7b8 + local_2c0._8_4_;
          auVar214._12_4_ = fStack_7b4 + local_2c0._12_4_;
          auVar214._16_4_ = fStack_7b0 + local_2c0._16_4_;
          auVar214._20_4_ = fStack_7ac + local_2c0._20_4_;
          auVar214._24_4_ = fStack_7a8 + local_2c0._24_4_;
          auVar214._28_4_ = fStack_7a4 + local_2c0._28_4_;
          auVar6 = vcmpps_avx(auVar214,auVar202,2);
          auVar124 = vandps_avx(local_8e0,local_8c0);
          auVar216 = ZEXT3264(auVar124);
          auVar124 = vandps_avx(auVar6,auVar124);
          auVar124 = vorps_avx(auVar117,auVar124);
          if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar124 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar124 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar124 >> 0x7f,0) != '\0') ||
                (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar124 >> 0xbf,0) != '\0') ||
              (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar124[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar93 * 0x60) = auVar124;
            auVar117 = vblendvps_avx(_local_2c0,local_300,auVar117);
            *(undefined1 (*) [32])(auStack_160 + uVar93 * 0x60) = auVar117;
            auVar63._8_8_ = uStack_918;
            auVar63._0_8_ = local_920;
            uVar2 = vmovlps_avx(auVar63);
            *(undefined8 *)(afStack_140 + uVar93 * 0x18) = uVar2;
            auStack_138[uVar93 * 0x18] = (int)uVar99 + 1;
            uVar93 = (ulong)((int)uVar93 + 1);
          }
        }
      }
    }
    do {
      if ((int)uVar93 == 0) {
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar116._4_4_ = uVar1;
        auVar116._0_4_ = uVar1;
        auVar116._8_4_ = uVar1;
        auVar116._12_4_ = uVar1;
        auVar192 = vcmpps_avx(local_4d0,auVar116,2);
        uVar95 = vmovmskps_avx(auVar192);
        uVar95 = (uint)local_8e8 & uVar95;
        if (uVar95 == 0) {
          return;
        }
        goto LAB_0166265b;
      }
      uVar94 = (ulong)((int)uVar93 - 1);
      lVar96 = uVar94 * 0x60;
      auVar117 = *(undefined1 (*) [32])(auStack_160 + lVar96);
      auVar123._0_4_ = auVar117._0_4_ + (float)local_7c0._0_4_;
      auVar123._4_4_ = auVar117._4_4_ + (float)local_7c0._4_4_;
      auVar123._8_4_ = auVar117._8_4_ + fStack_7b8;
      auVar123._12_4_ = auVar117._12_4_ + fStack_7b4;
      auVar123._16_4_ = auVar117._16_4_ + fStack_7b0;
      auVar123._20_4_ = auVar117._20_4_ + fStack_7ac;
      auVar123._24_4_ = auVar117._24_4_ + fStack_7a8;
      auVar123._28_4_ = auVar117._28_4_ + fStack_7a4;
      uVar98 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar203._4_4_ = uVar98;
      auVar203._0_4_ = uVar98;
      auVar203._8_4_ = uVar98;
      auVar203._12_4_ = uVar98;
      auVar203._16_4_ = uVar98;
      auVar203._20_4_ = uVar98;
      auVar203._24_4_ = uVar98;
      auVar203._28_4_ = uVar98;
      auVar6 = vcmpps_avx(auVar123,auVar203,2);
      auVar124 = vandps_avx(auVar6,*(undefined1 (*) [32])(auStack_180 + lVar96));
      _local_700 = auVar124;
      auVar6 = *(undefined1 (*) [32])(auStack_180 + lVar96) & auVar6;
      bVar56 = (auVar6 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar57 = (auVar6 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar55 = (auVar6 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar54 = SUB321(auVar6 >> 0x7f,0) == '\0';
      bVar53 = (auVar6 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar52 = SUB321(auVar6 >> 0xbf,0) == '\0';
      bVar100 = (auVar6 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar50 = -1 < auVar6[0x1f];
      if (((((((!bVar56 || !bVar57) || !bVar55) || !bVar54) || !bVar53) || !bVar52) || !bVar100) ||
          !bVar50) {
        auVar179._8_4_ = 0x7f800000;
        auVar179._0_8_ = 0x7f8000007f800000;
        auVar179._12_4_ = 0x7f800000;
        auVar179._16_4_ = 0x7f800000;
        auVar179._20_4_ = 0x7f800000;
        auVar179._24_4_ = 0x7f800000;
        auVar179._28_4_ = 0x7f800000;
        auVar117 = vblendvps_avx(auVar179,auVar117,auVar124);
        auVar6 = vshufps_avx(auVar117,auVar117,0xb1);
        auVar6 = vminps_avx(auVar117,auVar6);
        auVar8 = vshufpd_avx(auVar6,auVar6,5);
        auVar6 = vminps_avx(auVar6,auVar8);
        auVar8 = vpermpd_avx2(auVar6,0x4e);
        auVar6 = vminps_avx(auVar6,auVar8);
        auVar117 = vcmpps_avx(auVar117,auVar6,0);
        auVar6 = auVar124 & auVar117;
        if ((((((((auVar6 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar6 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar6 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar6 >> 0x7f,0) != '\0') ||
              (auVar6 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar6 >> 0xbf,0) != '\0') ||
            (auVar6 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar6[0x1f] < '\0') {
          auVar124 = vandps_avx(auVar117,auVar124);
        }
        fVar204 = afStack_140[uVar94 * 0x18 + 1];
        uVar99 = (ulong)auStack_138[uVar94 * 0x18];
        uVar91 = vmovmskps_avx(auVar124);
        iVar12 = 0;
        for (; (uVar91 & 1) == 0; uVar91 = uVar91 >> 1 | 0x80000000) {
          iVar12 = iVar12 + 1;
        }
        fVar217 = afStack_140[uVar94 * 0x18];
        auVar125._4_4_ = fVar217;
        auVar125._0_4_ = fVar217;
        auVar125._8_4_ = fVar217;
        auVar125._12_4_ = fVar217;
        auVar125._16_4_ = fVar217;
        auVar125._20_4_ = fVar217;
        auVar125._24_4_ = fVar217;
        auVar125._28_4_ = fVar217;
        *(undefined4 *)(local_700 + (uint)(iVar12 << 2)) = 0;
        *(undefined1 (*) [32])(auStack_180 + lVar96) = _local_700;
        if ((((((((_local_700 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (_local_700 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (_local_700 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(_local_700 >> 0x7f,0) != '\0') ||
              (_local_700 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(_local_700 >> 0xbf,0) != '\0') ||
            (_local_700 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_700[0x1f] < '\0') {
          uVar94 = uVar93;
        }
        fVar204 = fVar204 - fVar217;
        auVar163._4_4_ = fVar204;
        auVar163._0_4_ = fVar204;
        auVar163._8_4_ = fVar204;
        auVar163._12_4_ = fVar204;
        auVar163._16_4_ = fVar204;
        auVar163._20_4_ = fVar204;
        auVar163._24_4_ = fVar204;
        auVar163._28_4_ = fVar204;
        auVar192 = vfmadd132ps_fma(auVar163,auVar125,_DAT_02020f20);
        local_300 = ZEXT1632(auVar192);
        local_920 = *(undefined8 *)(local_300 + (uint)(iVar12 << 2));
        uStack_918 = 0;
      }
      uVar93 = uVar94;
    } while (((((((bVar56 && bVar57) && bVar55) && bVar54) && bVar53) && bVar52) && bVar100) &&
             bVar50);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }